

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  st_ptls_esni_secret_t **esni;
  ptls_key_exchange_algorithm_t *ppVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  ushort uVar5;
  uint16_t uVar6;
  ptls_context_t *ppVar7;
  char *pcVar8;
  anon_struct_72_2_510fbff9 *paVar9;
  st_ptls_on_client_hello_t *psVar10;
  st_ptls_on_extension_t *psVar11;
  ptls_cipher_suite_t *ppVar12;
  st_ptls_update_esni_key_t *psVar13;
  st_ptls_update_traffic_key_t *psVar14;
  st_ptls_hash_context_t *psVar15;
  ptls_buffer_t *ppVar16;
  ptls_buffer_t *ppVar17;
  undefined8 uVar18;
  ptls_aead_algorithm_t *ppVar19;
  intptr_t iVar20;
  char cVar21;
  ptls_iovec_t pVar22;
  ptls_iovec_t ikm;
  ptls_iovec_t pubkey_00;
  ptls_iovec_t pVar23;
  ptls_iovec_t tbs;
  ptls_aead_context_t *ppVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  en_ptls_state_t eVar28;
  uint uVar29;
  ptls_key_exchange_algorithm_t *ppVar30;
  size_t sVar31;
  st_ptls_esni_secret_t *psVar32;
  ulong uVar33;
  ptls_key_exchange_algorithm_t *ppVar34;
  ptls_key_schedule_t *ppVar35;
  uint8_t *puVar36;
  ptls_key_exchange_algorithm_t *ppVar37;
  long lVar38;
  uint8_t *puVar39;
  uint uVar40;
  ulong uVar41;
  undefined1 *puVar42;
  long lVar43;
  ptls_key_exchange_algorithm_t *ppVar44;
  size_t sVar45;
  size_t sVar46;
  ptls_hash_context_t **pppVar47;
  ptls_esni_context_t **pppVar48;
  size_t sVar49;
  size_t sVar50;
  ulong uVar51;
  size_t *psVar52;
  anon_struct_72_2_510fbff9 *paVar53;
  ulong uVar54;
  long lVar55;
  long lVar56;
  ulong uVar57;
  uint16_t *puVar58;
  uint32_t uVar59;
  ulong uVar60;
  size_t sVar61;
  byte bVar62;
  ushort uVar63;
  ptls_esni_context_t *ppVar64;
  ptls_key_exchange_context_t **pppVar65;
  ulong uVar66;
  ptls_key_exchange_algorithm_t *ppVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  char cVar71;
  bool bVar72;
  ptls_iovec_t pVar73;
  ptls_iovec_t ch_trunc;
  ptls_iovec_t tbs_00;
  uint8_t finished_key [64];
  ptls_aead_context_t *aead;
  int accept_early_data;
  size_t psk_index;
  anon_struct_24_2_cc7b932a key_share;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  st_ptls_client_hello_t ch;
  size_t local_658;
  size_t local_648;
  size_t local_640;
  size_t local_638;
  size_t local_628;
  size_t local_620;
  size_t local_618;
  size_t local_608;
  size_t local_600;
  uint8_t auStack_5f0 [6];
  ushort local_5ea;
  ptls_on_client_hello_parameters_t local_5e8;
  ptls_aead_context_t *local_588;
  ushort local_57c;
  uint16_t local_57a;
  ptls_cipher_suite_t **local_578;
  int local_56c;
  ptls_key_exchange_algorithm_t *local_568;
  size_t local_560;
  ptls_key_exchange_algorithm_t *local_558;
  ptls_iovec_t pStack_550;
  ulong local_540;
  ptls_iovec_t local_538;
  ptls_iovec_t local_528;
  st_ptls_client_hello_t local_518;
  
  sVar45 = message.len;
  puVar36 = message.base;
  memset(&local_518,0,0x4e8);
  local_518.unknown_extensions[0].type = 0xffff;
  local_558 = (ptls_key_exchange_algorithm_t *)0x0;
  pStack_550.base = (uint8_t *)0x0;
  pStack_550.len = 0;
  local_560 = 0xffffffffffffffff;
  local_528.base = (uint8_t *)0x0;
  local_528.len = 0;
  local_538.base = (uint8_t *)0x0;
  local_538.len = 0;
  local_56c = 0;
  eVar28 = tls->state;
  bVar68 = eVar28 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
  if ((tls->field_0x160 & 0x20) == 0) {
    local_5e8.server_name.base = puVar36 + 4;
    uVar29 = 0;
    if ((long)sVar45 < 6) {
      uVar27 = 0x32;
    }
    else {
      local_5e8.server_name.base = puVar36 + 6;
      bVar69 = (ushort)(*(ushort *)(puVar36 + 4) << 8 | *(ushort *)(puVar36 + 4) >> 8) == 0x303;
      uVar27 = 0x28;
      if (bVar69) {
        uVar27 = uVar29;
      }
      uVar29 = (uint)bVar69;
    }
    ppVar2 = (ptls_key_exchange_algorithm_t *)(puVar36 + sVar45);
    uVar26 = uVar27;
    if (((char)uVar29 != '\0') &&
       (uVar26 = 0x32, 0x1f < (long)ppVar2 - (long)local_5e8.server_name.base)) {
      local_518.random_bytes = local_5e8.server_name.base;
      ppVar30 = (ptls_key_exchange_algorithm_t *)((long)local_5e8.server_name.base + 0x20);
      uVar26 = 0x32;
      if ((ptls_key_exchange_algorithm_t *)((long)local_5e8.server_name.base + 0x20) == ppVar2) {
LAB_001107a7:
        local_5e8.server_name.base = (uint8_t *)ppVar30;
        bVar69 = false;
      }
      else {
        ppVar30 = (ptls_key_exchange_algorithm_t *)
                  ((long)&((ptls_key_exchange_algorithm_t *)
                          ((long)local_5e8.server_name.base + 0x20))->id + 1);
        uVar41 = (ulong)*(byte *)&((ptls_key_exchange_algorithm_t *)
                                  ((long)local_5e8.server_name.base + 0x20))->id;
        if ((ulong)((long)ppVar2 - (long)ppVar30) < uVar41) goto LAB_001107a7;
        bVar69 = *(byte *)&((ptls_key_exchange_algorithm_t *)
                           ((long)local_5e8.server_name.base + 0x20))->id < 0x21;
        local_5e8.server_name.base = (uint8_t *)ppVar30;
        if (bVar69) {
          local_518.legacy_session_id.base = (uint8_t *)ppVar30;
          local_5e8.server_name.base = (uint8_t *)((long)&ppVar30->id + uVar41);
          local_518.legacy_session_id.len = uVar41;
          bVar69 = true;
          uVar26 = uVar27;
        }
      }
      if (bVar69) {
        uVar29 = 0x32;
        if ((ulong)((long)ppVar2 - (long)local_5e8.server_name.base) < 2) {
LAB_001107fd:
          bVar69 = false;
        }
        else {
          lVar38 = 0;
          uVar41 = 0;
          do {
            uVar41 = (ulong)*(byte *)((long)(uint16_t *)local_5e8.server_name.base + lVar38) |
                     uVar41 << 8;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 2);
          ppVar30 = (ptls_key_exchange_algorithm_t *)((long)local_5e8.server_name.base + 2);
          local_5e8.server_name.base = (uint8_t *)ppVar30;
          if ((ulong)((long)ppVar2 - (long)ppVar30) < uVar41) goto LAB_001107fd;
          ppVar67 = (ptls_key_exchange_algorithm_t *)((long)ppVar30 + uVar41);
          local_518.cipher_suites.base = (uint8_t *)ppVar30;
          local_518.cipher_suites.len = uVar41;
          uVar41 = 0x200;
          while( true ) {
            lVar38 = (long)ppVar67 - (long)ppVar30;
            uVar27 = 0x32;
            local_5e8.server_name.base = (uint8_t *)ppVar30;
            if (lVar38 < 2) break;
            *(uint16_t *)((long)local_518.signature_algorithms.list + (uVar41 - 0x60)) =
                 ppVar30->id << 8 | ppVar30->id >> 8;
            ppVar30 = (ptls_key_exchange_algorithm_t *)&ppVar30->field_0x2;
            uVar27 = 0;
            local_518.client_ciphers.count = local_518.client_ciphers.count + 1;
            local_5e8.server_name.base = (uint8_t *)ppVar67;
            if ((0x23d < uVar41) ||
               (uVar41 = uVar41 + 2, local_5e8.server_name.base = (uint8_t *)ppVar30,
               ppVar30 == ppVar67)) break;
          }
          uVar29 = 0x32;
          if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67) {
            uVar29 = uVar27;
          }
          if (lVar38 < 2) {
            uVar29 = uVar27;
          }
          bVar69 = 1 < lVar38 &&
                   (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67;
        }
        uVar26 = uVar29;
        if (bVar69) {
          ppVar30 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base;
          uVar26 = 0x32;
          if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar2) {
LAB_00110912:
            local_5e8.server_name.base = (uint8_t *)ppVar30;
            bVar69 = false;
            ppVar30 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base;
          }
          else {
            ppVar30 = (ptls_key_exchange_algorithm_t *)
                      ((long)(uint16_t *)local_5e8.server_name.base + 1);
            uVar41 = (ulong)(byte)*(uint16_t *)local_5e8.server_name.base;
            if ((ulong)((long)ppVar2 - (long)ppVar30) < uVar41) goto LAB_00110912;
            bVar69 = uVar41 != 0;
            if (bVar69) {
              ppVar67 = (ptls_key_exchange_algorithm_t *)
                        ((long)(uint16_t *)local_5e8.server_name.base + uVar41 + 1);
              local_518.compression_methods.ids = (uint8_t *)ppVar30;
              local_518.compression_methods.count = (long)ppVar67 - (long)ppVar30;
              bVar69 = true;
              uVar26 = uVar29;
              ppVar30 = ppVar67;
            }
          }
          local_5e8.server_name.base = (uint8_t *)ppVar30;
          if (bVar69) {
            local_588 = (st_ptls_aead_context_t *)0x0;
            puVar39 = local_5e8.server_name.base;
            if ((ulong)((long)ppVar2 - (long)local_5e8.server_name.base) < 2) {
LAB_001109ac:
              local_5e8.server_name.base = puVar39;
              bVar69 = false;
              bVar70 = false;
              uVar26 = 0x32;
            }
            else {
              lVar38 = 0;
              uVar41 = 0;
              do {
                uVar41 = (ulong)*(byte *)((long)(uint16_t *)local_5e8.server_name.base + lVar38) |
                         uVar41 << 8;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 2);
              puVar39 = (uint8_t *)((long)local_5e8.server_name.base + 2);
              if ((ulong)((long)ppVar2 - (long)puVar39) < uVar41) goto LAB_001109ac;
              bVar70 = uVar41 == 0;
              if (bVar70) {
                bVar69 = false;
                local_5e8.server_name.base = puVar39;
              }
              else {
                ppVar30 = (ptls_key_exchange_algorithm_t *)
                          ((undefined1 *)((long)local_5e8.server_name.base + 2) + uVar41);
                bVar70 = false;
                uVar29 = 0;
                local_5e8.server_name.base = puVar39;
                while( true ) {
                  uVar63 = (ushort)uVar29;
                  uVar26 = 0x32;
                  if ((long)ppVar30 - (long)local_5e8.server_name.base < 2) break;
                  uVar5 = *(uint16_t *)local_5e8.server_name.base;
                  uVar63 = uVar5 << 8 | uVar5 >> 8;
                  uVar29 = (uint)uVar63;
                  puVar39 = (uint8_t *)((long)local_5e8.server_name.base + 2);
                  if (uVar63 < 0x40) {
                    if ((*(byte *)((long)&local_588 + (ulong)(uVar63 >> 3)) >> (uVar29 & 7) & 1) !=
                        0) {
                      uVar26 = 0x2f;
                      local_5e8.server_name.base = puVar39;
                      break;
                    }
                    pbVar4 = (byte *)((long)&local_588 + (ulong)(uVar63 >> 3));
                    *pbVar4 = *pbVar4 | (byte)(1 << ((byte)(uVar5 >> 8) & 7));
                  }
                  uVar26 = 0x32;
                  if ((ulong)((long)ppVar30 - (long)puVar39) < 2) {
LAB_00110ea3:
                    local_5e8.server_name.base = puVar39;
                    bVar69 = false;
                    goto LAB_00111e36;
                  }
                  lVar38 = 0;
                  uVar41 = 0;
                  do {
                    uVar41 = (ulong)puVar39[lVar38] | uVar41 << 8;
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 2);
                  puVar42 = (undefined1 *)((long)local_5e8.server_name.base + 4);
                  uVar27 = 0;
                  local_5e8.server_name.base = puVar42;
                  if ((ulong)((long)ppVar30 - (long)puVar42) < uVar41) goto LAB_00110eec;
                  psVar11 = tls->ctx->on_extension;
                  if (psVar11 != (st_ptls_on_extension_t *)0x0) {
                    pVar73.len = uVar41;
                    pVar73.base = puVar42;
                    iVar25 = (*psVar11->cb)(psVar11,tls,'\x01',uVar63,pVar73);
                    bVar69 = iVar25 != 0;
                    uVar26 = (uint)bVar69;
                    uVar27 = (uint)bVar69;
                    if (iVar25 == 0) goto LAB_00110f89;
                    goto LAB_00110f4e;
                  }
LAB_00110f89:
                  puVar39 = local_5e8.server_name.base;
                  ppVar67 = (ptls_key_exchange_algorithm_t *)(puVar42 + uVar41);
                  uVar26 = uVar27;
                  if (uVar29 < 0x1b) {
                    if (uVar29 < 10) {
                      if (uVar29 != 0) {
                        if (uVar29 != 5) goto switchD_00110fc1_caseD_2e;
                        local_518._1248_1_ = local_518._1248_1_ | 1;
                        goto LAB_00111e25;
                      }
                      uVar26 = client_hello_decode_server_name
                                         (&local_518.server_name,(uint8_t **)&local_5e8,
                                          (uint8_t *)ppVar67);
                      if (uVar26 == 0) {
                        uVar26 = 0;
                        if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67)
                        goto LAB_00111e25;
                        uVar26 = 0x32;
                      }
                      goto LAB_00110f4e;
                    }
                    if (uVar29 == 10) {
                      local_518.negotiated_groups.base = local_5e8.server_name.base;
                      local_518.negotiated_groups.len =
                           (long)ppVar67 - (long)local_5e8.server_name.base;
                    }
                    else {
                      if (uVar29 != 0xd) {
                        if (uVar29 != 0x10) goto switchD_00110fc1_caseD_2e;
                        uVar26 = 0x32;
                        if ((ulong)((long)ppVar67 - (long)local_5e8.server_name.base) < 2) {
                          bVar69 = false;
                        }
                        else {
                          lVar38 = 0;
                          uVar41 = 0;
                          do {
                            uVar41 = (ulong)*(byte *)((long)(uint16_t *)local_5e8.server_name.base +
                                                     lVar38) | uVar41 << 8;
                            lVar38 = lVar38 + 1;
                          } while (lVar38 != 2);
                          local_5e8.server_name.base =
                               (uint8_t *)((long)local_5e8.server_name.base + 2);
                          if ((ulong)((long)ppVar67 - (long)local_5e8.server_name.base) < uVar41) {
                            bVar69 = false;
                          }
                          else {
                            ppVar37 = (ptls_key_exchange_algorithm_t *)
                                      (local_5e8.server_name.base + uVar41);
                            local_540 = local_518.alpn.count;
                            do {
                              if (ppVar37 ==
                                  (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base) {
                                bVar69 = false;
                                uVar27 = 0x32;
                              }
                              else {
                                ppVar34 = (ptls_key_exchange_algorithm_t *)
                                          ((long)&((ptls_key_exchange_algorithm_t *)
                                                  local_5e8.server_name.base)->id + 1);
                                uVar41 = (ulong)(byte)((ptls_key_exchange_algorithm_t *)
                                                      local_5e8.server_name.base)->id;
                                if ((ulong)((long)ppVar37 - (long)ppVar34) < uVar41) {
                                  bVar69 = false;
                                }
                                else {
                                  bVar69 = uVar41 != 0;
                                  if (bVar69) {
                                    local_5e8.server_name.base =
                                         (uint8_t *)
                                         ((long)&((ptls_key_exchange_algorithm_t *)
                                                 local_5e8.server_name.base)->id + uVar41 + 1);
                                    bVar69 = true;
                                    if (local_540 < 0x10) {
                                      local_518.alpn.count = local_540 + 1;
                                      local_518.alpn.list[local_540].base = (uint8_t *)ppVar34;
                                      local_518.alpn.list[local_540].len =
                                           (long)local_5e8.server_name.base - (long)ppVar34;
                                      local_540 = local_540 + 1;
                                    }
                                    goto LAB_00111558;
                                  }
                                }
                                uVar27 = 0x32;
                                local_5e8.server_name.base = (uint8_t *)ppVar34;
                              }
LAB_00111558:
                              uVar26 = uVar27;
                            } while ((bVar69) &&
                                    ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base !=
                                     ppVar37));
                          }
                        }
                        if (bVar69) {
                          if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67
                             ) goto LAB_00111e25;
                          uVar26 = 0x32;
                        }
                        goto LAB_00110eec;
                      }
                      uVar26 = decode_signature_algorithms
                                         (&local_518.signature_algorithms,(uint8_t **)&local_5e8,
                                          (uint8_t *)ppVar67);
                      if (uVar26 != 0) goto LAB_00110f4e;
                      uVar26 = 0;
                    }
                    goto LAB_00111e25;
                  }
                  switch(uVar29) {
                  case 0x29:
                    if ((ulong)((long)ppVar67 - (long)local_5e8.server_name.base) < 2) {
                      uVar54 = 0;
                      bVar69 = false;
                      uVar27 = 0x32;
                    }
                    else {
                      lVar38 = 0;
                      uVar41 = 0;
                      do {
                        uVar54 = uVar41;
                        lVar55 = uVar54 * 0x100;
                        uVar33 = (ulong)*(byte *)((long)(uint16_t *)local_5e8.server_name.base +
                                                 lVar38);
                        uVar41 = lVar55 + uVar33;
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != 2);
                      ppVar37 = (ptls_key_exchange_algorithm_t *)
                                ((long)local_5e8.server_name.base + 2);
                      local_5e8.server_name.base = (uint8_t *)ppVar37;
                      if ((ulong)((long)ppVar67 - (long)ppVar37) < uVar41) {
                        uVar54 = 0;
                        bVar69 = false;
                        uVar27 = 0x32;
                      }
                      else {
                        ppVar34 = (ptls_key_exchange_algorithm_t *)
                                  ((long)ppVar37 + uVar33 + uVar54 * 0x100);
                        uVar54 = 0;
                        uVar41 = local_518.psk.identities.count;
                        do {
                          bVar69 = true;
                          if ((ulong)((long)ppVar34 - (long)ppVar37) < 2) {
                            uVar57 = 0;
                            bVar72 = false;
                            ppVar44 = (ptls_key_exchange_algorithm_t *)0x0;
                            uVar27 = 0x32;
                          }
                          else {
                            lVar38 = 2;
                            uVar57 = 0;
                            ppVar44 = ppVar37;
                            do {
                              uVar66 = uVar57 * 0x100;
                              local_5e8.server_name.base = (uint8_t *)((long)&ppVar44->id + 1);
                              uVar51 = (ulong)(byte)ppVar44->id;
                              uVar57 = uVar66 + uVar51;
                              lVar38 = lVar38 + -1;
                              ppVar44 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base;
                            } while (lVar38 != 0);
                            bVar72 = false;
                            if ((long)puVar39 + ((uVar33 + lVar55) - (long)ppVar37) < uVar57) {
                              uVar57 = 0;
                              ppVar37 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base;
                              ppVar44 = (ptls_key_exchange_algorithm_t *)0x0;
                              uVar27 = 0x32;
                            }
                            else {
                              ppVar37 = (ptls_key_exchange_algorithm_t *)
                                        ((long)&((ptls_key_exchange_algorithm_t *)
                                                local_5e8.server_name.base)->id + (uVar66 | uVar51))
                              ;
                              bVar72 = true;
                              bVar69 = false;
                              local_5e8.server_name.base = (uint8_t *)ppVar37;
                            }
                          }
                          if (bVar72) {
                            lVar38 = (long)ppVar34 - (long)ppVar37;
                            if (lVar38 < 4) {
                              uVar27 = 0x32;
                              uVar59 = 0;
                            }
                            else {
                              uVar27 = *(uint *)ppVar37;
                              uVar59 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 |
                                       (uVar27 & 0xff00) << 8 | uVar27 << 0x18;
                              ppVar37 = (ptls_key_exchange_algorithm_t *)&ppVar37->field_0x4;
                              uVar27 = 0;
                              local_5e8.server_name.base = (uint8_t *)ppVar37;
                            }
                            bVar69 = true;
                            if (3 < lVar38) {
                              uVar51 = uVar41;
                              if (uVar41 < 4) {
                                uVar51 = uVar41 + 1;
                                local_518.psk.identities.count = uVar51;
                                local_518.psk.identities.list[uVar41].identity.base =
                                     (uint8_t *)ppVar44;
                                local_518.psk.identities.list[uVar41].identity.len = uVar57;
                                local_518.psk.identities.list[uVar41].obfuscated_ticket_age = uVar59
                                ;
                                *(undefined8 *)&local_518.psk.identities.list[uVar41].field_0x14 = 0
                                ;
                                *(undefined8 *)
                                 ((long)&local_518.psk.identities.list[uVar41].binder.base + 4) = 0;
                                *(undefined4 *)
                                 ((long)&local_518.psk.identities.list[uVar41].binder.len + 4) = 0;
                              }
                              uVar54 = uVar54 + 1;
                              bVar69 = false;
                              uVar27 = 0;
                              uVar41 = uVar51;
                            }
                          }
                          bVar69 = !bVar69;
                        } while ((bVar69) && (ppVar37 != ppVar34));
                      }
                    }
                    sVar50 = local_518.psk.identities.count;
                    if (bVar69) {
                      local_518.psk.hash_end = local_5e8.server_name.base;
                      uVar26 = 0x32;
                      if ((ulong)((long)ppVar67 - (long)local_5e8.server_name.base) < 2) {
LAB_00111956:
                        bVar69 = false;
                      }
                      else {
                        lVar38 = 0;
                        uVar41 = 0;
                        do {
                          uVar41 = (ulong)*(byte *)((long)(uint16_t *)local_5e8.server_name.base +
                                                   lVar38) | uVar41 << 8;
                          lVar38 = lVar38 + 1;
                        } while (lVar38 != 2);
                        local_5e8.server_name.base =
                             (uint8_t *)((long)local_5e8.server_name.base + 2);
                        if ((ulong)((long)ppVar67 - (long)local_5e8.server_name.base) < uVar41)
                        goto LAB_00111956;
                        ppVar34 = (ptls_key_exchange_algorithm_t *)
                                  (local_5e8.server_name.base + uVar41);
                        psVar52 = &local_518.psk.identities.list[0].binder.len;
                        uVar41 = 0;
                        ppVar37 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base;
                        do {
                          ppVar44 = ppVar37;
                          if (ppVar34 == ppVar37) {
LAB_00111a3f:
                            bVar69 = false;
                            uVar27 = 0x32;
                          }
                          else {
                            ppVar44 = (ptls_key_exchange_algorithm_t *)((long)&ppVar37->id + 1);
                            uVar33 = (ulong)(byte)ppVar37->id;
                            local_5e8.server_name.base = (uint8_t *)ppVar44;
                            if ((ulong)((long)ppVar34 - (long)ppVar44) < uVar33) goto LAB_00111a3f;
                            if (uVar41 < sVar50) {
                              ((ptls_iovec_t *)(psVar52 + -1))->base = (uint8_t *)ppVar44;
                              *psVar52 = uVar33;
                            }
                            ppVar44 = (ptls_key_exchange_algorithm_t *)((long)&ppVar44->id + uVar33)
                            ;
                            bVar69 = true;
                            local_5e8.server_name.base = (uint8_t *)ppVar44;
                          }
                          if (!bVar69) goto LAB_00111a85;
                          uVar41 = uVar41 + 1;
                          psVar52 = psVar52 + 5;
                          ppVar37 = ppVar44;
                        } while (ppVar44 != ppVar34);
                        bVar69 = uVar54 == uVar41;
                        if (!bVar69) {
                          uVar27 = 0x2f;
                        }
LAB_00111a85:
                        uVar26 = 0x32;
                        if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar34)
                        {
                          uVar26 = uVar27;
                        }
                        if (!bVar69) {
                          uVar26 = uVar27;
                        }
                        bVar69 = (bool)((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base
                                        == ppVar34 & bVar69);
                      }
                      if (bVar69) {
                        bVar69 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base ==
                                 ppVar67;
                        if (!bVar69) {
                          uVar26 = 0x32;
                        }
                      }
                      else {
                        bVar69 = false;
                      }
                    }
                    else {
                      bVar69 = false;
                      uVar26 = uVar27;
                    }
                    puVar39 = local_5e8.server_name.base;
                    if (!bVar69) goto LAB_00110ea3;
                    break;
                  case 0x2a:
                    local_518.psk.early_data_indication = 1;
                    break;
                  case 0x2b:
                    uVar26 = 0x32;
                    if (ppVar67 == (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base) {
LAB_00111200:
                      bVar69 = false;
                    }
                    else {
                      ppVar37 = (ptls_key_exchange_algorithm_t *)
                                ((long)(uint16_t *)local_5e8.server_name.base + 1);
                      uVar41 = (ulong)(byte)*(uint16_t *)local_5e8.server_name.base;
                      local_5e8.server_name.base = (uint8_t *)ppVar37;
                      if ((ulong)((long)ppVar67 - (long)ppVar37) < uVar41) goto LAB_00111200;
                      ppVar34 = (ptls_key_exchange_algorithm_t *)((long)&ppVar37->id + uVar41);
                      lVar38 = 4;
                      do {
                        lVar55 = (long)ppVar34 - (long)ppVar37;
                        uVar27 = 0x32;
                        bVar69 = 1 < lVar55;
                        if (1 < lVar55) {
                          local_57a = ppVar37->id << 8 | ppVar37->id >> 8;
                          ppVar37 = (ptls_key_exchange_algorithm_t *)&ppVar37->field_0x2;
                          uVar27 = 0;
                          local_5e8.server_name.base = (uint8_t *)ppVar37;
                        }
                        lVar43 = lVar38;
                        if (lVar38 != 0 && 1 < lVar55) {
                          puVar58 = supported_versions;
                          lVar56 = 0;
                          do {
                            lVar43 = lVar56;
                            if (*puVar58 == local_57a) break;
                            lVar56 = lVar56 + 1;
                            puVar58 = puVar58 + 1;
                            lVar43 = lVar38;
                          } while (lVar38 != lVar56);
                        }
                        if (lVar55 < 2) goto LAB_00111691;
                        lVar38 = lVar43;
                      } while (ppVar37 != ppVar34);
                      bVar69 = true;
                      if (lVar43 != 4) {
                        local_518.selected_version = supported_versions[lVar43];
                      }
LAB_00111691:
                      uVar26 = 0x32;
                      if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar34) {
                        uVar26 = uVar27;
                      }
                      if (!bVar69) {
                        uVar26 = uVar27;
                      }
                      bVar69 = (bool)((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base ==
                                      ppVar34 & bVar69);
                    }
                    if (bVar69) {
LAB_001116e1:
                      if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67)
                      break;
                      uVar26 = 0x32;
                    }
                    goto LAB_00110eec;
                  case 0x2c:
                    uVar26 = 0x2f;
                    if ((properties == (ptls_handshake_properties_t *)0x0) ||
                       ((properties->field_0).server.cookie.key == (void *)0x0)) goto LAB_00110eec;
                    local_518.cookie.all.base = local_5e8.server_name.base;
                    local_518.cookie.all.len = (long)ppVar67 - (long)local_5e8.server_name.base;
                    uVar26 = 0x32;
                    puVar3 = local_5e8.server_name.base;
                    if ((ulong)((long)ppVar67 - (long)local_5e8.server_name.base) < 2) {
LAB_001112b4:
                      local_5e8.server_name.base = puVar3;
                      bVar69 = false;
                    }
                    else {
                      lVar38 = 0;
                      uVar41 = 0;
                      do {
                        uVar33 = uVar41;
                        uVar54 = uVar33 * 0x100;
                        uVar57 = (ulong)*(byte *)((long)(uint16_t *)local_5e8.server_name.base +
                                                 lVar38);
                        uVar41 = uVar54 + uVar57;
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != 2);
                      puVar3 = (uint8_t *)((long)local_5e8.server_name.base + 2);
                      if ((ulong)((long)ppVar67 - (long)puVar3) < uVar41) goto LAB_001112b4;
                      local_518.cookie.tbs.base = puVar3;
                      bVar69 = true;
                      uVar26 = 0x32;
                      ppVar37 = (ptls_key_exchange_algorithm_t *)puVar3;
                      if (1 < uVar41) {
                        lVar38 = 0;
                        uVar41 = 0;
                        do {
                          uVar66 = uVar41;
                          uVar60 = uVar66 * 0x100;
                          uVar51 = (ulong)(byte)((undefined1 *)
                                                ((long)local_5e8.server_name.base + 2))[lVar38];
                          uVar41 = uVar60 + uVar51;
                          lVar38 = lVar38 + 1;
                        } while (lVar38 != 2);
                        ppVar37 = (ptls_key_exchange_algorithm_t *)
                                  ((long)local_5e8.server_name.base + 4);
                        if (uVar41 <= (uVar54 | uVar57) - 2) {
                          uVar40 = 0x32;
                          bVar69 = true;
                          if (uVar41 == 0) {
                            bVar72 = false;
                          }
                          else {
                            ppVar37 = (ptls_key_exchange_algorithm_t *)
                                      ((long)local_5e8.server_name.base + 5);
                            uVar41 = (ulong)(byte)*(undefined1 *)
                                                   ((long)local_5e8.server_name.base + 4);
                            bVar72 = false;
                            if (uVar41 <= (long)local_5e8.server_name.base +
                                          ((uVar60 | uVar51) - (long)ppVar37) + 4) {
                              local_518.cookie.ch1_hash.base = (uint8_t *)ppVar37;
                              local_518.cookie.ch1_hash.len = uVar41;
                              bVar72 = true;
                              bVar69 = false;
                              ppVar37 = (ptls_key_exchange_algorithm_t *)
                                        ((undefined1 *)((long)local_5e8.server_name.base + 5) +
                                        uVar41);
                              uVar40 = uVar27;
                            }
                          }
                          local_5e8.server_name.base = (uint8_t *)ppVar37;
                          uVar26 = uVar40;
                          ppVar37 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base;
                          if (bVar72) {
                            ppVar34 = (ptls_key_exchange_algorithm_t *)
                                      (&((ptls_key_exchange_algorithm_t *)
                                        ((long)puVar39 + uVar66 * 8 * 0x20))->field_0x4 + uVar51);
                            bVar69 = true;
                            uVar26 = 0x32;
                            if (ppVar34 !=
                                (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base) {
                              ppVar37 = (ptls_key_exchange_algorithm_t *)
                                        ((long)(uint16_t *)local_5e8.server_name.base + 1);
                              cVar71 = (char)*(uint16_t *)local_5e8.server_name.base;
                              if (cVar71 == '\x01') {
                                local_518.cookie._64_1_ = local_518.cookie._64_1_ | 1;
                              }
                              else {
                                if (cVar71 != '\0') goto LAB_00111eaa;
                                if ((local_518.cookie._64_1_ & 1) != 0) {
                                  local_5e8.server_name.base = (uint8_t *)ppVar37;
                                  __assert_fail("!ch->cookie.sent_key_share",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                                                ,0xcd7,
                                                "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                               );
                                }
                              }
                              bVar69 = ppVar34 != ppVar37;
                              uVar26 = uVar40;
                              if (bVar69) {
                                uVar26 = 0x32;
                              }
                            }
                          }
                        }
                      }
LAB_00111eaa:
                      local_5e8.server_name.base = (uint8_t *)ppVar37;
                      if (!bVar69) {
                        ppVar37 = (ptls_key_exchange_algorithm_t *)
                                  (puVar3 + uVar57 + uVar33 * 0x100);
                        local_518.cookie.tbs.len = (long)local_5e8.server_name.base - (long)puVar3;
                        bVar69 = true;
                        uVar27 = 0x32;
                        if (ppVar37 == (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base)
                        {
                          bVar72 = false;
                        }
                        else {
                          ppVar34 = (ptls_key_exchange_algorithm_t *)
                                    ((long)(uint16_t *)local_5e8.server_name.base + 1);
                          uVar41 = (ulong)(byte)*(uint16_t *)local_5e8.server_name.base;
                          bVar72 = false;
                          local_5e8.server_name.base = (uint8_t *)ppVar34;
                          if (uVar41 <= (ulong)((long)ppVar37 - (long)ppVar34)) {
                            local_518.cookie.signature.base = (uint8_t *)ppVar34;
                            local_5e8.server_name.base = (uint8_t *)((long)&ppVar34->id + uVar41);
                            local_518.cookie.signature.len = uVar41;
                            bVar72 = true;
                            bVar69 = false;
                            uVar27 = uVar26;
                          }
                        }
                        uVar26 = uVar27;
                        if ((bVar72) &&
                           (bVar69 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base !=
                                     ppVar37, bVar69)) {
                          uVar26 = 0x32;
                        }
                      }
                      bVar69 = !bVar69;
                    }
                    if (bVar69) {
                      if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67)
                      break;
                      uVar26 = 0x32;
                    }
LAB_00110f4e:
                    bVar69 = false;
                    goto LAB_00111e36;
                  case 0x2d:
                    uVar26 = 0x32;
                    if (ppVar67 == (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base) {
LAB_001111b1:
                      bVar69 = false;
                    }
                    else {
                      ppVar37 = (ptls_key_exchange_algorithm_t *)
                                ((long)(uint16_t *)local_5e8.server_name.base + 1);
                      uVar41 = (ulong)(byte)*(uint16_t *)local_5e8.server_name.base;
                      local_5e8.server_name.base = (uint8_t *)ppVar37;
                      if ((ulong)((long)ppVar67 - (long)ppVar37) < uVar41) goto LAB_001111b1;
                      bVar69 = uVar41 != 0;
                      uVar40 = local_518.psk.ke_modes;
                      if (bVar69) {
                        do {
                          uVar26 = (uint)(byte)ppVar37->id;
                          if (uVar26 < 0x20) {
                            uVar40 = uVar40 | 1 << (uVar26 & 0x1f);
                            local_518.psk.ke_modes = uVar40;
                          }
                          ppVar37 = (ptls_key_exchange_algorithm_t *)((long)&ppVar37->id + 1);
                          uVar41 = uVar41 - 1;
                        } while (uVar41 != 0);
                        bVar69 = true;
                        uVar26 = uVar27;
                        local_5e8.server_name.base = (uint8_t *)ppVar37;
                      }
                    }
                    if (bVar69) goto LAB_001116e1;
LAB_00110eec:
                    bVar69 = false;
                    goto LAB_00111e36;
                  case 0x2e:
                  case 0x2f:
                  case 0x30:
                  case 0x31:
                  case 0x32:
switchD_00110fc1_caseD_2e:
                    handle_unknown_extension
                              (tls,properties,uVar63,local_5e8.server_name.base,(uint8_t *)ppVar67,
                               local_518.unknown_extensions);
                    break;
                  case 0x33:
                    local_518.key_shares.base = local_5e8.server_name.base;
                    local_518.key_shares.len = (long)ppVar67 - (long)local_5e8.server_name.base;
                    break;
                  default:
                    if (uVar29 == 0x1b) {
                      uVar26 = 0x32;
                      if (ppVar67 == (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base) {
LAB_001112ee:
                        bVar69 = false;
                      }
                      else {
                        ppVar37 = (ptls_key_exchange_algorithm_t *)
                                  ((long)(uint16_t *)local_5e8.server_name.base + 1);
                        uVar41 = (ulong)(byte)*(uint16_t *)local_5e8.server_name.base;
                        local_5e8.server_name.base = (uint8_t *)ppVar37;
                        if ((ulong)((long)ppVar67 - (long)ppVar37) < uVar41) goto LAB_001112ee;
                        ppVar34 = (ptls_key_exchange_algorithm_t *)((long)&ppVar37->id + uVar41);
                        sVar50 = local_518.cert_compression_algos.count;
                        do {
                          lVar38 = (long)ppVar34 - (long)ppVar37;
                          uVar26 = 0x32;
                          if (1 < lVar38) {
                            local_57c = ppVar37->id << 8 | ppVar37->id >> 8;
                            ppVar37 = (ptls_key_exchange_algorithm_t *)&ppVar37->field_0x2;
                            uVar26 = 0;
                          }
                          uVar41 = sVar50;
                          bVar69 = true;
                          if (1 < lVar38) {
                            bVar69 = false;
                            if (sVar50 < 0x10) {
                              uVar41 = sVar50 + 1;
                              local_518.cert_compression_algos.count = uVar41;
                              local_518.cert_compression_algos.list[sVar50] = local_57c;
                              bVar69 = false;
                            }
                          }
                          if (lVar38 < 2) goto LAB_0011177b;
                          sVar50 = uVar41;
                        } while (ppVar37 != ppVar34);
                        bVar69 = false;
LAB_0011177b:
                        bVar69 = !bVar69;
                        local_5e8.server_name.base = (uint8_t *)ppVar37;
                      }
                      if (bVar69) {
                        if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67)
                        break;
                        uVar26 = 0x32;
                      }
                      goto LAB_00110f4e;
                    }
                    if (uVar29 != 0xffce) goto switchD_00110fc1_caseD_2e;
                    if (local_518.esni.cipher == (ptls_cipher_suite_t *)0x0) {
                      lVar38 = (long)ppVar67 - (long)local_5e8.server_name.base;
                      uVar26 = 0x32;
                      if (1 < lVar38) {
                        local_5ea = *(uint16_t *)local_5e8.server_name.base << 8 |
                                    *(uint16_t *)local_5e8.server_name.base >> 8;
                        local_5e8.server_name.base =
                             (uint8_t *)((long)local_5e8.server_name.base + 2);
                        uVar26 = 0;
                      }
                      bVar69 = true;
                      if (lVar38 < 2) {
                        bVar72 = false;
                      }
                      else {
                        local_578 = tls->ctx->cipher_suites;
                        uVar26 = 0x2f;
                        bVar72 = *local_578 != (ptls_cipher_suite_t *)0x0;
                        if (bVar72) {
                          if ((*local_578)->id != local_5ea) {
                            do {
                              local_578 = local_578 + 1;
                              ppVar12 = *local_578;
                              bVar72 = ppVar12 != (ptls_cipher_suite_t *)0x0;
                              if (ppVar12 == (ptls_cipher_suite_t *)0x0) {
                                goto LAB_0011198a;
                              }
                            } while (ppVar12->id != local_5ea);
                          }
                          bVar69 = false;
                          uVar26 = 0;
                        }
                      }
LAB_0011198a:
                      if (bVar72) {
                        uVar26 = select_key_share(&local_518.esni.key_share,&local_518.esni.peer_key
                                                  ,tls->ctx->key_exchanges,(uint8_t **)&local_5e8,
                                                  (uint8_t *)ppVar67,1);
                        if (uVar26 == 0) {
                          uVar26 = 0x32;
                          bVar69 = true;
                          if (1 < (ulong)((long)ppVar67 - (long)local_5e8.server_name.base)) {
                            lVar38 = 0;
                            uVar41 = 0;
                            do {
                              uVar41 = (ulong)*(byte *)((long)(uint16_t *)local_5e8.server_name.base
                                                       + lVar38) | uVar41 << 8;
                              lVar38 = lVar38 + 1;
                            } while (lVar38 != 2);
                            local_5e8.server_name.base =
                                 (uint8_t *)((long)local_5e8.server_name.base + 2);
                            if (uVar41 <= (ulong)((long)ppVar67 - (long)local_5e8.server_name.base))
                            {
                              ppVar37 = (ptls_key_exchange_algorithm_t *)
                                        (local_5e8.server_name.base + uVar41);
                              uVar33 = (*local_578)->hash->digest_size;
                              if (uVar41 != uVar33) {
                                uVar27 = 0x2f;
                              }
                              else {
                                local_518.esni.record_digest = local_5e8.server_name.base;
                                uVar27 = 0;
                                local_5e8.server_name.base = (uint8_t *)ppVar37;
                              }
                              uVar26 = 0x32;
                              if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base ==
                                  ppVar37) {
                                uVar26 = uVar27;
                              }
                              bVar69 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base
                                       != ppVar37;
                              if (uVar41 != uVar33) {
                                uVar26 = uVar27;
                                bVar69 = uVar41 != uVar33;
                              }
                            }
                          }
                          if (!bVar69) {
                            uVar27 = 0x32;
                            bVar69 = true;
                            if (1 < (ulong)((long)ppVar67 - (long)local_5e8.server_name.base)) {
                              lVar38 = 0;
                              uVar41 = 0;
                              do {
                                uVar41 = (ulong)*(byte *)((long)(uint16_t *)
                                                                local_5e8.server_name.base + lVar38)
                                         | uVar41 << 8;
                                lVar38 = lVar38 + 1;
                              } while (lVar38 != 2);
                              local_5e8.server_name.base =
                                   (uint8_t *)((long)local_5e8.server_name.base + 2);
                              if (uVar41 <= (ulong)((long)ppVar67 - (long)local_5e8.server_name.base
                                                   )) {
                                ppVar37 = (ptls_key_exchange_algorithm_t *)
                                          (local_5e8.server_name.base + uVar41);
                                uVar33 = (*local_578)->aead->tag_size;
                                if (uVar33 <= uVar41) {
                                  local_518.esni.encrypted_sni.base = local_5e8.server_name.base;
                                  local_518.esni.encrypted_sni.len = uVar41;
                                  local_5e8.server_name.base = (uint8_t *)ppVar37;
                                }
                                else {
                                  uVar26 = 0x2f;
                                }
                                uVar27 = 0x32;
                                if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base ==
                                    ppVar37) {
                                  uVar27 = uVar26;
                                }
                                bVar69 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base
                                         != ppVar37;
                                if (uVar41 < uVar33) {
                                  uVar27 = uVar26;
                                  bVar69 = uVar33 > uVar41;
                                }
                              }
                            }
                            uVar26 = uVar27;
                            if (!bVar69) {
                              if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base !=
                                  ppVar67) {
                                uVar26 = 0x32;
                                goto LAB_001119cd;
                              }
                              local_518.esni.cipher = *local_578;
                              bVar69 = false;
                            }
                          }
                        }
                        else {
LAB_001119cd:
                          bVar69 = true;
                        }
                      }
                    }
                    else {
                      uVar26 = 0x2f;
                      bVar69 = true;
                    }
                    puVar39 = local_5e8.server_name.base;
                    if (bVar69) goto LAB_00110ea3;
                  }
LAB_00111e25:
                  bVar69 = true;
                  local_5e8.server_name.base = (uint8_t *)ppVar67;
LAB_00111e36:
                  if ((!bVar69) ||
                     (bVar70 = (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base ==
                               ppVar30, bVar70)) break;
                }
                bVar69 = uVar63 == 0x29;
              }
            }
            if ((bVar70) &&
               (uVar26 = 0x32, (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar2
               )) {
              lVar38 = 0;
              do {
                puVar58 = (uint16_t *)((long)supported_versions + lVar38);
                if (*puVar58 == local_518.selected_version) break;
                bVar70 = lVar38 != 6;
                lVar38 = lVar38 + 2;
              } while (bVar70);
              uVar26 = 0x46;
              if ((((*puVar58 == local_518.selected_version) &&
                   (uVar26 = 0x2f, local_518.compression_methods.count == 1)) &&
                  ((char)*(uint16_t *)local_518.compression_methods.ids == '\0')) &&
                 ((local_518.esni.cipher == (ptls_cipher_suite_t *)0x0 ||
                  ((ptls_key_exchange_algorithm_t *)local_518.key_shares.base !=
                   (ptls_key_exchange_algorithm_t *)0x0)))) {
                if ((ptls_key_exchange_algorithm_t *)local_518.psk.hash_end ==
                    (ptls_key_exchange_algorithm_t *)0x0) {
                  if (local_518.psk.early_data_indication == 0) goto LAB_00112cdf;
                }
                else if (bVar69) {
LAB_00112cdf:
                  uVar26 = 0;
                }
              }
            }
          }
        }
      }
    }
    ppVar12 = local_518.esni.cipher;
    puVar39 = local_518.random_bytes;
    if (uVar26 != 0) goto LAB_00112324;
    ppVar7 = tls->ctx;
    if ((ppVar7->field_0x68 & 1) != 0) {
      local_518.psk.ke_modes = local_518.psk.ke_modes & 0xfffffffe;
    }
    if (eVar28 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      uVar18 = *(undefined8 *)local_518.random_bytes;
      ppVar19 = *(ptls_aead_algorithm_t **)((long)local_518.random_bytes + 8);
      iVar20 = *(intptr_t *)((long)local_518.random_bytes + 0x18);
      *(ptls_hash_algorithm_t **)(tls->client_random + 0x10) =
           *(ptls_hash_algorithm_t **)((long)local_518.random_bytes + 0x10);
      *(intptr_t *)(tls->client_random + 0x18) = iVar20;
      *(undefined8 *)tls->client_random = uVar18;
      *(ptls_aead_algorithm_t **)(tls->client_random + 8) = ppVar19;
      if ((local_518.esni.cipher != (ptls_cipher_suite_t *)0x0) &&
         (ppVar7->esni != (ptls_esni_context_t **)0x0)) {
        local_588 = (st_ptls_aead_context_t *)0x0;
        if (tls->esni != (st_ptls_esni_secret_t *)0x0) {
          __assert_fail("*secret == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                        ,0xba0,
                        "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, struct st_ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                       );
        }
        esni = &tls->esni;
        psVar32 = (st_ptls_esni_secret_t *)malloc(200);
        *esni = psVar32;
        if (psVar32 != (st_ptls_esni_secret_t *)0x0) {
          memset(psVar32,0,200);
          puVar3 = local_518.esni.record_digest;
          pppVar48 = ppVar7->esni;
          ppVar64 = *pppVar48;
          uVar29 = 0x2f;
          if (ppVar64 != (ptls_esni_context_t *)0x0) {
            bVar69 = false;
            do {
              paVar9 = ppVar64->cipher_suites;
              cVar71 = '\x04';
              if (paVar9->cipher_suite != (ptls_cipher_suite_t *)0x0) {
                if (paVar9->cipher_suite->id == ppVar12->id) {
                  bVar70 = false;
                  lVar38 = 0;
                }
                else {
                  lVar38 = 0;
                  paVar53 = paVar9;
                  do {
                    paVar53 = paVar53 + 1;
                    bVar70 = paVar53->cipher_suite == (ptls_cipher_suite_t *)0x0;
                    if (bVar70) goto LAB_00110c5a;
                    lVar38 = lVar38 + 1;
                  } while (paVar53->cipher_suite->id != ppVar12->id);
                }
                if (!bVar70) {
                  iVar25 = bcmp(paVar9[lVar38].record_digest,puVar3,ppVar12->hash->digest_size);
                  cVar71 = iVar25 == 0;
                }
              }
LAB_00110c5a:
              if (cVar71 != '\0') {
                if ((cVar71 == '\x01') && (!bVar69)) {
                  pppVar65 = ppVar64->key_exchanges;
                  if (*pppVar65 == (ptls_key_exchange_context_t *)0x0) goto LAB_00111fcc;
                  uVar6 = (local_518.esni.key_share)->id;
                  if ((*pppVar65)->algo->id != uVar6) goto LAB_00111fac;
                  bVar69 = false;
                  goto LAB_00111fc4;
                }
                break;
              }
              ppVar64 = pppVar48[1];
              pppVar48 = pppVar48 + 1;
              bVar69 = ppVar64 == (ptls_esni_context_t *)0x0;
            } while (!bVar69);
            ppVar37 = (ptls_key_exchange_algorithm_t *)0x0;
            goto LAB_00110dad;
          }
          goto LAB_00111fcc;
        }
        uVar26 = 0x201;
        local_638 = 0;
        ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
        goto LAB_0011203e;
      }
      bVar69 = true;
      local_638 = local_518.server_name.len;
      ppVar30 = (ptls_key_exchange_algorithm_t *)local_518.server_name.base;
      if ((ptls_key_exchange_algorithm_t *)local_518.server_name.base ==
          (ptls_key_exchange_algorithm_t *)0x0) {
        local_638 = 0;
        ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
      }
      bVar62 = 0;
      goto LAB_00110c9c;
    }
    uVar26 = 0x32;
    if (local_518.psk.early_data_indication != 0) goto LAB_00112324;
    iVar25 = (*ptls_mem_equal)(tls->client_random,local_518.random_bytes,0x20);
    if (iVar25 == 0) {
      uVar26 = 0x28;
      goto LAB_00112324;
    }
    pcVar8 = tls->server_name;
    if (pcVar8 != (char *)0x0) {
      sVar31 = strlen(pcVar8);
      if (local_518.server_name.len == sVar31) {
        iVar25 = bcmp(local_518.server_name.base,pcVar8,sVar31);
        cVar71 = (iVar25 != 0) * '\x03';
        uVar26 = 0x28;
        if (iVar25 == 0) {
          uVar26 = 0;
        }
      }
      else {
        uVar26 = 0x28;
        cVar71 = '\x03';
      }
      if (cVar71 == '\x03') goto LAB_00112324;
      if (cVar71 != '\0') {
        return uVar26;
      }
    }
    goto LAB_00112072;
  }
  local_518.psk.ke_modes = tls->handshake_ke_modes;
LAB_00110615:
  uVar26 = send_certificate_and_certificate_verify
                     (tls,emitter,&local_518.signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                      "TLS 1.3, server CertificateVerify",(byte)local_518._1248_1_ & 1);
  if ((tls->field_0x160 & 0x20) != 0) {
    tls->handshake_ke_modes = local_518.psk.ke_modes;
    return 0x202;
  }
  if (uVar26 != 0) goto LAB_00112324;
  goto LAB_00110659;
  while (pppVar65 = pppVar65 + 1, (*pppVar1)->algo->id != uVar6) {
LAB_00111fac:
    pppVar1 = pppVar65 + 1;
    bVar69 = *pppVar1 == (ptls_key_exchange_context_t *)0x0;
    if (bVar69) goto LAB_00111fcc;
  }
LAB_00111fc4:
  if (bVar69) {
LAB_00111fcc:
    local_638 = 0;
    ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
    ppVar67 = (ptls_key_exchange_algorithm_t *)0x0;
    uVar26 = uVar29;
  }
  else {
    pubkey_00.len = local_518.esni.peer_key.len;
    pubkey_00.base = local_518.esni.peer_key.base;
    uVar26 = build_esni_contents_hash
                       (ppVar12->hash,psVar32->esni_contents_hash,local_518.esni.record_digest,uVar6
                        ,pubkey_00,puVar39);
    if (uVar26 == 0) {
      pVar23.len = local_518.esni.peer_key.len;
      pVar23.base = local_518.esni.peer_key.base;
      local_638 = 0;
      uVar26 = (*(*pppVar65)->on_exchange)(pppVar65,0,&(*esni)->secret,pVar23);
      ppVar12 = local_518.esni.cipher;
      if (uVar26 == 0) {
        sVar31 = (ulong)(*pppVar48)->padded_length + 0x10;
        local_638 = 0;
        ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
        ppVar67 = (ptls_key_exchange_algorithm_t *)0x0;
        uVar26 = uVar29;
        if (local_518.esni.encrypted_sni.len - (local_518.esni.cipher)->aead->tag_size == sVar31) {
          ppVar37 = (ptls_key_exchange_algorithm_t *)malloc(sVar31);
          if (ppVar37 == (ptls_key_exchange_algorithm_t *)0x0) {
            uVar29 = 0x201;
            goto LAB_00111fcc;
          }
          uVar29 = create_esni_aead(&local_588,0,ppVar12,(*esni)->secret,(*esni)->esni_contents_hash
                                   );
          sVar61 = local_518.esni.encrypted_sni.len;
          puVar3 = local_518.esni.encrypted_sni.base;
          sVar50 = local_518.key_shares.len;
          puVar39 = local_518.key_shares.base;
          ppVar24 = local_588;
          if (uVar29 == 0) {
            sVar46 = local_588->algo->iv_size;
            if (sVar46 - 8 != 0) {
              memcpy(&local_5e8,local_588->static_iv,sVar46 - 8);
            }
            lVar38 = -0x40;
            do {
              auStack_5f0[sVar46] = ppVar24->static_iv[sVar46 - 8];
              sVar46 = sVar46 + 1;
              lVar38 = lVar38 + 8;
            } while (lVar38 != 0);
            sVar50 = (*ppVar24->do_decrypt)(ppVar24,ppVar37,puVar3,sVar61,&local_5e8,puVar39,sVar50)
            ;
            ppVar67 = ppVar37;
            if (sVar50 == (ulong)(*pppVar48)->padded_length + 0x10) {
              ptls_aead_free(ppVar24);
              local_588 = (st_ptls_aead_context_t *)0x0;
              local_568 = ppVar37;
              if ((ulong)(*pppVar48)->padded_length < 0x10) {
LAB_00112f08:
                local_638 = 0;
                ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
                uVar26 = 0x2f;
              }
              else {
                ppVar30 = (ptls_key_exchange_algorithm_t *)
                          ((long)&ppVar37->id + (ulong)(*pppVar48)->padded_length);
                psVar32 = *esni;
                ppVar19 = (ptls_aead_algorithm_t *)ppVar37->create;
                *(undefined8 *)psVar32->nonce = *(undefined8 *)ppVar37;
                *(ptls_aead_algorithm_t **)(psVar32->nonce + 8) = ppVar19;
                local_568 = (ptls_key_exchange_algorithm_t *)&ppVar37->exchange;
                uVar26 = client_hello_decode_server_name
                                   (&local_5e8.server_name,(uint8_t **)&local_568,(uint8_t *)ppVar30
                                   );
                local_638 = local_5e8.server_name.len;
                if (uVar26 == 0) {
                  for (; local_568 != ppVar30;
                      local_568 = (ptls_key_exchange_algorithm_t *)((long)&local_568->id + 1)) {
                    if ((char)local_568->id != '\0') goto LAB_00112f08;
                  }
                  memmove(ppVar37,local_5e8.server_name.base,local_5e8.server_name.len);
                  uVar26 = 0;
                  ppVar67 = (ptls_key_exchange_algorithm_t *)0x0;
                  ppVar30 = ppVar37;
                }
                else {
                  local_638 = 0;
                  ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
                }
              }
            }
            else {
              local_638 = 0;
              ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
              uVar26 = 0x33;
            }
            goto LAB_00111fdf;
          }
LAB_00110dad:
          local_638 = 0;
          ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
          ppVar67 = ppVar37;
          uVar26 = uVar29;
        }
      }
      else {
        ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
        ppVar67 = (ptls_key_exchange_algorithm_t *)0x0;
      }
    }
    else {
      local_638 = 0;
      ppVar30 = (ptls_key_exchange_algorithm_t *)0x0;
      ppVar67 = (ptls_key_exchange_algorithm_t *)0x0;
    }
  }
LAB_00111fdf:
  if (ppVar67 != (ptls_key_exchange_algorithm_t *)0x0) {
    free(ppVar67);
  }
  ppVar24 = local_588;
  if (local_588 != (st_ptls_aead_context_t *)0x0) {
    (*local_588->dispose_crypto)(local_588);
    (*ptls_clear_memory)(ppVar24->static_iv,ppVar24->algo->iv_size);
    free(ppVar24);
  }
  if ((uVar26 != 0) && (*esni != (st_ptls_esni_secret_t *)0x0)) {
    free_esni_secret(esni,1);
  }
LAB_0011203e:
  cVar71 = '\x03';
  if (uVar26 == 0) {
    psVar13 = tls->ctx->update_esni_key;
    bVar62 = 1;
    if ((psVar13 == (st_ptls_update_esni_key_t *)0x0) ||
       (uVar26 = (*psVar13->cb)(psVar13,tls,tls->esni->secret,(local_518.esni.cipher)->hash,
                                tls->esni->esni_contents_hash), uVar26 == 0)) {
      bVar69 = false;
LAB_00110c9c:
      if (tls->ctx->on_client_hello == (ptls_on_client_hello_t *)0x0) {
        uVar26 = 0;
      }
      else {
        local_5e8.negotiated_protocols.list = local_518.alpn.list;
        local_5e8.negotiated_protocols.count = local_518.alpn.count;
        local_5e8.signature_algorithms.list = local_518.signature_algorithms.list;
        local_5e8.signature_algorithms.count = local_518.signature_algorithms.count;
        local_5e8.certificate_compression_algorithms.list = local_518.cert_compression_algos.list;
        local_5e8.certificate_compression_algorithms.count = local_518.cert_compression_algos.count;
        local_5e8.cipher_suites.list = local_518.client_ciphers.list;
        local_5e8.cipher_suites.count = local_518.client_ciphers.count;
        local_5e8._80_1_ = local_5e8._80_1_ & 0xfe | bVar62;
        psVar10 = tls->ctx->on_client_hello;
        local_5e8.server_name.base = (uint8_t *)ppVar30;
        local_5e8.server_name.len = local_638;
        uVar26 = (*psVar10->cb)(psVar10,tls,&local_5e8);
      }
      if (!bVar69) {
        free(ppVar30);
      }
      cVar71 = (uVar26 != 0) * '\x03';
    }
  }
  if (cVar71 != '\0') {
joined_r0x00112067:
    if (cVar71 != '\x03') {
      return uVar26;
    }
    goto LAB_00112324;
  }
LAB_00112072:
  uVar26 = select_cipher((ptls_cipher_suite_t **)&local_5e8,tls->ctx->cipher_suites,
                         local_518.cipher_suites.base,
                         local_518.cipher_suites.base + local_518.cipher_suites.len);
  iVar25 = 3;
  if (uVar26 == 0) {
    if (eVar28 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      uVar26 = 0x28;
      if ((ptls_key_exchange_algorithm_t *)tls->cipher_suite !=
          (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base) goto LAB_001121a1;
    }
    else {
      tls->cipher_suite = (ptls_cipher_suite_t *)local_5e8.server_name.base;
      ppVar35 = key_schedule_new((ptls_cipher_suite_t *)local_5e8.server_name.base,
                                 (ptls_cipher_suite_t **)0x0,tls->ctx->hkdf_label_prefix__obsolete);
      tls->key_schedule = ppVar35;
    }
    iVar25 = 0;
    uVar26 = 0;
  }
LAB_001121a1:
  if (iVar25 == 3) goto LAB_00112324;
  if (iVar25 != 0) {
    return uVar26;
  }
  if ((ptls_key_exchange_algorithm_t *)local_518.key_shares.base !=
      (ptls_key_exchange_algorithm_t *)0x0 && local_558 == (ptls_key_exchange_algorithm_t *)0x0) {
    local_5e8.server_name.base = local_518.key_shares.base;
    ppVar30 = (ptls_key_exchange_algorithm_t *)
              ((long)(uint16_t *)local_518.key_shares.base + local_518.key_shares.len);
    cVar71 = '\x03';
    if (local_518.key_shares.len < 2) {
      uVar29 = 0x32;
    }
    else {
      lVar38 = 0;
      uVar41 = 0;
      do {
        uVar41 = (ulong)*(byte *)((long)(uint16_t *)local_518.key_shares.base + lVar38) |
                 uVar41 << 8;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 2);
      local_5e8.server_name.base = (uint8_t *)((long)local_518.key_shares.base + 2);
      uVar29 = 0x32;
      if (uVar41 <= (ulong)((long)ppVar30 - (long)local_5e8.server_name.base)) {
        ppVar67 = (ptls_key_exchange_algorithm_t *)(local_5e8.server_name.base + uVar41);
        uVar27 = select_key_share(&local_558,&pStack_550,tls->ctx->key_exchanges,
                                  (uint8_t **)&local_5e8,(uint8_t *)ppVar67,0);
        uVar29 = 0x32;
        if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar67) {
          uVar29 = 0;
        }
        if (uVar27 != 0) {
          uVar29 = uVar27;
        }
        cVar71 = (uVar27 != 0 ||
                 (ptls_key_exchange_algorithm_t *)local_5e8.server_name.base != ppVar67) * '\x03';
      }
    }
    uVar26 = 0x32;
    if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base == ppVar30) {
      uVar26 = uVar29;
    }
    cVar21 = ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base != ppVar30) * '\x03';
    if (cVar71 != '\0') {
      uVar26 = uVar29;
      cVar21 = cVar71;
    }
    if (cVar21 == '\x03') goto LAB_00112324;
    if (cVar21 != '\0') {
      return uVar26;
    }
  }
  ppVar30 = local_558;
  if (eVar28 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (local_558 == (ptls_key_exchange_algorithm_t *)0x0 || local_518.cookie.all.len == 0) {
      if ((local_558 == (ptls_key_exchange_algorithm_t *)0x0) ||
         ((properties != (ptls_handshake_properties_t *)0x0 &&
          ((*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0)))) {
        if ((ptls_key_exchange_algorithm_t *)local_518.negotiated_groups.base ==
            (ptls_key_exchange_algorithm_t *)0x0) {
          uVar26 = 0x6d;
          goto LAB_00112324;
        }
        uVar26 = select_negotiated_group
                           ((ptls_key_exchange_algorithm_t **)&local_5e8,tls->ctx->key_exchanges,
                            local_518.negotiated_groups.base,
                            (uint8_t *)
                            ((long)(uint16_t *)local_518.negotiated_groups.base +
                            local_518.negotiated_groups.len));
        if (uVar26 == 0) {
          ppVar35 = tls->key_schedule;
          if (ppVar35->num_hashes != 0) {
            pppVar47 = &ppVar35->hashes[0].ctx;
            sVar50 = 0;
            do {
              (*(*pppVar47)->update)(*pppVar47,puVar36,sVar45);
              sVar50 = sVar50 + 1;
              pppVar47 = pppVar47 + 2;
            } while (sVar50 != ppVar35->num_hashes);
          }
          if (tls->key_schedule->generation != 0) {
            __assert_fail("tls->key_schedule->generation == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                          ,0xe8a,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          if ((properties == (ptls_handshake_properties_t *)0x0) ||
             ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
            key_schedule_transform_post_ch1hash(tls->key_schedule);
            key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
            uVar26 = (*emitter->begin_message)(emitter);
            if (uVar26 == 0) {
              ppVar16 = emitter->buf;
              ppVar35 = tls->key_schedule;
              sVar45 = ppVar16->off;
              uVar26 = ptls_buffer_reserve(ppVar16,1);
              if (uVar26 == 0) {
                ppVar16->base[ppVar16->off] = '\x02';
                ppVar16->off = ppVar16->off + 1;
                uVar26 = 0;
              }
              cVar71 = '\x03';
              if (uVar26 == 0) {
                uVar26 = ptls_buffer_reserve(ppVar16,3);
                if (uVar26 == 0) {
                  puVar36 = ppVar16->base;
                  sVar50 = ppVar16->off;
                  puVar36[sVar50 + 2] = '\0';
                  puVar36 = puVar36 + sVar50;
                  puVar36[0] = '\0';
                  puVar36[1] = '\0';
                  ppVar16->off = ppVar16->off + 3;
                  uVar26 = 0;
                }
                cVar71 = '\x03';
                if (uVar26 == 0) {
                  sVar50 = ppVar16->off;
                  ppVar17 = emitter->buf;
                  uVar26 = ptls_buffer_reserve(ppVar17,2);
                  if (uVar26 == 0) {
                    puVar36 = ppVar17->base;
                    sVar61 = ppVar17->off;
                    (puVar36 + sVar61)[0] = '\x03';
                    (puVar36 + sVar61)[1] = '\x03';
                    ppVar17->off = ppVar17->off + 2;
                    uVar26 = 0;
                  }
                  bVar68 = uVar26 != 0;
                  if (uVar26 == 0) {
                    uVar26 = ptls_buffer_reserve(emitter->buf,0x20);
                    if (uVar26 == 0) {
                      puVar36 = emitter->buf->base;
                      sVar61 = emitter->buf->off;
                      puVar39 = puVar36 + sVar61 + 0x10;
                      puVar39[0] = 0xc2;
                      puVar39[1] = 0xa2;
                      puVar39[2] = '\x11';
                      puVar39[3] = '\x16';
                      puVar39[4] = 'z';
                      puVar39[5] = 0xbb;
                      puVar39[6] = 0x8c;
                      puVar39[7] = '^';
                      puVar39[8] = '\a';
                      puVar39[9] = 0x9e;
                      puVar39[10] = '\t';
                      puVar39[0xb] = 0xe2;
                      puVar39[0xc] = 200;
                      puVar39[0xd] = 0xa8;
                      puVar39[0xe] = '3';
                      puVar39[0xf] = 0x9c;
                      puVar36 = puVar36 + sVar61;
                      puVar36[0] = 0xcf;
                      puVar36[1] = '!';
                      puVar36[2] = 0xad;
                      puVar36[3] = 't';
                      puVar36[4] = 0xe5;
                      puVar36[5] = 0x9a;
                      puVar36[6] = 'a';
                      puVar36[7] = '\x11';
                      puVar36[8] = 0xbe;
                      puVar36[9] = '\x1d';
                      puVar36[10] = 0x8c;
                      puVar36[0xb] = '\x02';
                      puVar36[0xc] = '\x1e';
                      puVar36[0xd] = 'e';
                      puVar36[0xe] = 0xb8;
                      puVar36[0xf] = 0x91;
                      ppVar17 = emitter->buf;
                      ppVar17->off = ppVar17->off + 0x20;
                      uVar26 = ptls_buffer_reserve(ppVar17,1);
                      if (uVar26 == 0) {
                        ppVar17->base[ppVar17->off] = '\0';
                        ppVar17->off = ppVar17->off + 1;
                        uVar26 = 0;
                      }
                      cVar71 = '\x03';
                      if (uVar26 == 0) {
                        sVar61 = emitter->buf->off;
                        uVar26 = ptls_buffer__do_pushv
                                           (emitter->buf,local_518.legacy_session_id.base,
                                            local_518.legacy_session_id.len);
                        bVar68 = false;
                        if (uVar26 == 0) {
                          emitter->buf->base[sVar61 - 1] =
                               (char)(int)emitter->buf->off - (char)sVar61;
                          bVar68 = true;
                          cVar71 = '\0';
                        }
                      }
                      else {
                        bVar68 = false;
                      }
                      if (bVar68) {
                        uVar63 = tls->cipher_suite->id;
                        ppVar17 = emitter->buf;
                        uVar26 = ptls_buffer_reserve(ppVar17,2);
                        if (uVar26 == 0) {
                          *(ushort *)(ppVar17->base + ppVar17->off) = uVar63 << 8 | uVar63 >> 8;
                          ppVar17->off = ppVar17->off + 2;
                          uVar26 = 0;
                        }
                        bVar68 = uVar26 != 0;
                        if (bVar68) goto LAB_00112c3e;
                        ppVar17 = emitter->buf;
                        uVar26 = ptls_buffer_reserve(ppVar17,1);
                        if (uVar26 == 0) {
                          ppVar17->base[ppVar17->off] = '\0';
                          ppVar17->off = ppVar17->off + 1;
                          uVar26 = 0;
                        }
                        cVar71 = '\x03';
                        if (uVar26 == 0) {
                          ppVar17 = emitter->buf;
                          uVar26 = ptls_buffer_reserve(ppVar17,2);
                          if (uVar26 == 0) {
                            puVar36 = ppVar17->base;
                            sVar61 = ppVar17->off;
                            (puVar36 + sVar61)[0] = '\0';
                            (puVar36 + sVar61)[1] = '\0';
                            ppVar17->off = ppVar17->off + 2;
                            uVar26 = 0;
                          }
                          cVar71 = '\x03';
                          if (uVar26 == 0) {
                            ppVar17 = emitter->buf;
                            local_600 = ppVar17->off;
                            uVar26 = ptls_buffer_reserve(ppVar17,2);
                            if (uVar26 == 0) {
                              puVar36 = ppVar17->base;
                              sVar61 = ppVar17->off;
                              (puVar36 + sVar61)[0] = '\0';
                              (puVar36 + sVar61)[1] = '+';
                              ppVar17->off = ppVar17->off + 2;
                              uVar26 = 0;
                            }
                            if (uVar26 == 0) {
                              ppVar17 = emitter->buf;
                              uVar26 = ptls_buffer_reserve(ppVar17,2);
                              uVar6 = local_518.selected_version;
                              if (uVar26 == 0) {
                                puVar36 = ppVar17->base;
                                sVar61 = ppVar17->off;
                                (puVar36 + sVar61)[0] = '\0';
                                (puVar36 + sVar61)[1] = '\0';
                                ppVar17->off = ppVar17->off + 2;
                                uVar26 = 0;
                              }
                              cVar71 = '\x03';
                              if (uVar26 == 0) {
                                ppVar17 = emitter->buf;
                                sVar61 = ppVar17->off;
                                uVar26 = ptls_buffer_reserve(ppVar17,2);
                                if (uVar26 == 0) {
                                  *(uint16_t *)(ppVar17->base + ppVar17->off) =
                                       uVar6 << 8 | uVar6 >> 8;
                                  ppVar17->off = ppVar17->off + 2;
                                  uVar26 = 0;
                                }
                                if (uVar26 == 0) {
                                  uVar41 = emitter->buf->off - sVar61;
                                  lVar38 = 8;
                                  do {
                                    emitter->buf->base[sVar61 - 2] =
                                         (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                    lVar38 = lVar38 + -8;
                                    sVar61 = sVar61 + 1;
                                  } while (lVar38 != -8);
                                  cVar71 = '\0';
                                }
                                else {
                                  cVar71 = (uVar26 != 0) * '\x03';
                                }
                              }
                              puVar36 = local_5e8.server_name.base;
                              if (cVar71 == '\0') {
                                if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base ==
                                    (ptls_key_exchange_algorithm_t *)0x0 ||
                                    ppVar30 != (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00114600:
                                  cVar71 = '\0';
                                }
                                else {
                                  ppVar17 = emitter->buf;
                                  uVar26 = ptls_buffer_reserve(ppVar17,2);
                                  if (uVar26 == 0) {
                                    puVar39 = ppVar17->base;
                                    sVar61 = ppVar17->off;
                                    (puVar39 + sVar61)[0] = '\0';
                                    (puVar39 + sVar61)[1] = '3';
                                    ppVar17->off = ppVar17->off + 2;
                                    uVar26 = 0;
                                  }
                                  bVar68 = uVar26 != 0;
                                  if (uVar26 == 0) {
                                    ppVar17 = emitter->buf;
                                    uVar26 = ptls_buffer_reserve(ppVar17,2);
                                    if (uVar26 == 0) {
                                      puVar39 = ppVar17->base;
                                      sVar61 = ppVar17->off;
                                      (puVar39 + sVar61)[0] = '\0';
                                      (puVar39 + sVar61)[1] = '\0';
                                      ppVar17->off = ppVar17->off + 2;
                                      uVar26 = 0;
                                    }
                                    cVar71 = '\x03';
                                    if (uVar26 != 0) goto LAB_00114754;
                                    ppVar17 = emitter->buf;
                                    sVar61 = ppVar17->off;
                                    uVar63 = *(uint16_t *)puVar36;
                                    uVar26 = ptls_buffer_reserve(ppVar17,2);
                                    if (uVar26 == 0) {
                                      *(ushort *)(ppVar17->base + ppVar17->off) =
                                           uVar63 << 8 | uVar63 >> 8;
                                      ppVar17->off = ppVar17->off + 2;
                                      uVar26 = 0;
                                    }
                                    bVar68 = uVar26 != 0;
                                    if (!bVar68) {
                                      uVar41 = emitter->buf->off - sVar61;
                                      lVar38 = 8;
                                      do {
                                        emitter->buf->base[sVar61 - 2] =
                                             (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                        lVar38 = lVar38 + -8;
                                        sVar61 = sVar61 + 1;
                                      } while (lVar38 != -8);
                                      goto LAB_00114600;
                                    }
                                  }
                                  cVar71 = bVar68 * '\x03';
                                }
LAB_00114754:
                                if (cVar71 == '\0') {
                                  uVar41 = emitter->buf->off - local_600;
                                  lVar38 = 8;
                                  do {
                                    emitter->buf->base[local_600 - 2] =
                                         (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                    lVar38 = lVar38 + -8;
                                    local_600 = local_600 + 1;
                                    cVar71 = '\0';
                                  } while (lVar38 != -8);
                                }
                              }
                            }
                            else {
                              cVar71 = (uVar26 != 0) * '\x03';
                            }
                          }
                          if (cVar71 == '\0') {
                            uVar41 = ppVar16->off - sVar50;
                            lVar38 = 0x10;
                            do {
                              ppVar16->base[sVar50 - 3] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f))
                              ;
                              lVar38 = lVar38 + -8;
                              sVar50 = sVar50 + 1;
                              cVar71 = '\0';
                            } while (lVar38 != -8);
                          }
                        }
                      }
                    }
                  }
                  else {
LAB_00112c3e:
                    cVar71 = bVar68 * '\x03';
                  }
                }
                if (((cVar71 == '\0') && (cVar71 = '\0', ppVar35 != (ptls_key_schedule_t *)0x0)) &&
                   (ppVar35->num_hashes != 0)) {
                  puVar36 = ppVar16->base;
                  sVar50 = ppVar16->off;
                  pppVar47 = &ppVar35->hashes[0].ctx;
                  cVar71 = '\0';
                  sVar61 = 0;
                  do {
                    (*(*pppVar47)->update)(*pppVar47,puVar36 + sVar45,sVar50 - sVar45);
                    sVar61 = sVar61 + 1;
                    pppVar47 = pppVar47 + 2;
                  } while (sVar61 != ppVar35->num_hashes);
                }
              }
              if (cVar71 == '\0') {
                uVar26 = (*emitter->commit_message)(emitter);
                cVar71 = (uVar26 != 0) * '\x03';
              }
            }
            else {
              cVar71 = '\x03';
            }
            if (cVar71 == '\0') {
              uVar26 = push_change_cipher_spec(tls,emitter->buf);
              cVar71 = '\x03';
              if (uVar26 == 0) {
                tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                if (local_518.psk.early_data_indication != 0) {
                  (tls->field_20).server.early_data_skipped_bytes = 0;
                }
                uVar26 = 0x202;
              }
            }
            goto joined_r0x00112067;
          }
          uVar26 = (*emitter->begin_message)(emitter);
          if (uVar26 == 0) {
            ppVar16 = emitter->buf;
            uVar26 = ptls_buffer_reserve(ppVar16,1);
            if (uVar26 == 0) {
              ppVar16->base[ppVar16->off] = '\x02';
              ppVar16->off = ppVar16->off + 1;
              uVar26 = 0;
            }
            cVar71 = '\x03';
            if (uVar26 == 0) {
              uVar26 = ptls_buffer_reserve(ppVar16,3);
              if (uVar26 == 0) {
                puVar36 = ppVar16->base;
                sVar45 = ppVar16->off;
                puVar36[sVar45 + 2] = '\0';
                puVar36 = puVar36 + sVar45;
                puVar36[0] = '\0';
                puVar36[1] = '\0';
                ppVar16->off = ppVar16->off + 3;
                uVar26 = 0;
              }
              if (uVar26 == 0) {
                sVar45 = ppVar16->off;
                ppVar17 = emitter->buf;
                uVar26 = ptls_buffer_reserve(ppVar17,2);
                if (uVar26 == 0) {
                  puVar36 = ppVar17->base;
                  sVar50 = ppVar17->off;
                  (puVar36 + sVar50)[0] = '\x03';
                  (puVar36 + sVar50)[1] = '\x03';
                  ppVar17->off = ppVar17->off + 2;
                  uVar26 = 0;
                }
                bVar68 = uVar26 != 0;
                if (uVar26 == 0) {
                  uVar26 = ptls_buffer_reserve(emitter->buf,0x20);
                  if (uVar26 == 0) {
                    puVar36 = emitter->buf->base;
                    sVar50 = emitter->buf->off;
                    puVar39 = puVar36 + sVar50 + 0x10;
                    puVar39[0] = 0xc2;
                    puVar39[1] = 0xa2;
                    puVar39[2] = '\x11';
                    puVar39[3] = '\x16';
                    puVar39[4] = 'z';
                    puVar39[5] = 0xbb;
                    puVar39[6] = 0x8c;
                    puVar39[7] = '^';
                    puVar39[8] = '\a';
                    puVar39[9] = 0x9e;
                    puVar39[10] = '\t';
                    puVar39[0xb] = 0xe2;
                    puVar39[0xc] = 200;
                    puVar39[0xd] = 0xa8;
                    puVar39[0xe] = '3';
                    puVar39[0xf] = 0x9c;
                    puVar36 = puVar36 + sVar50;
                    puVar36[0] = 0xcf;
                    puVar36[1] = '!';
                    puVar36[2] = 0xad;
                    puVar36[3] = 't';
                    puVar36[4] = 0xe5;
                    puVar36[5] = 0x9a;
                    puVar36[6] = 'a';
                    puVar36[7] = '\x11';
                    puVar36[8] = 0xbe;
                    puVar36[9] = '\x1d';
                    puVar36[10] = 0x8c;
                    puVar36[0xb] = '\x02';
                    puVar36[0xc] = '\x1e';
                    puVar36[0xd] = 'e';
                    puVar36[0xe] = 0xb8;
                    puVar36[0xf] = 0x91;
                    ppVar17 = emitter->buf;
                    ppVar17->off = ppVar17->off + 0x20;
                    uVar26 = ptls_buffer_reserve(ppVar17,1);
                    if (uVar26 == 0) {
                      ppVar17->base[ppVar17->off] = '\0';
                      ppVar17->off = ppVar17->off + 1;
                      uVar26 = 0;
                    }
                    cVar71 = '\x03';
                    if (uVar26 == 0) {
                      sVar50 = emitter->buf->off;
                      uVar26 = ptls_buffer__do_pushv
                                         (emitter->buf,local_518.legacy_session_id.base,
                                          local_518.legacy_session_id.len);
                      bVar68 = false;
                      if (uVar26 == 0) {
                        emitter->buf->base[sVar50 - 1] = (char)(int)emitter->buf->off - (char)sVar50
                        ;
                        bVar68 = true;
                        cVar71 = '\0';
                      }
                    }
                    else {
                      bVar68 = false;
                    }
                    if (bVar68) {
                      uVar63 = tls->cipher_suite->id;
                      ppVar17 = emitter->buf;
                      uVar26 = ptls_buffer_reserve(ppVar17,2);
                      if (uVar26 == 0) {
                        *(ushort *)(ppVar17->base + ppVar17->off) = uVar63 << 8 | uVar63 >> 8;
                        ppVar17->off = ppVar17->off + 2;
                        uVar26 = 0;
                      }
                      bVar68 = uVar26 != 0;
                      if (bVar68) goto LAB_00112d99;
                      ppVar17 = emitter->buf;
                      uVar26 = ptls_buffer_reserve(ppVar17,1);
                      if (uVar26 == 0) {
                        ppVar17->base[ppVar17->off] = '\0';
                        ppVar17->off = ppVar17->off + 1;
                        uVar26 = 0;
                      }
                      cVar71 = '\x03';
                      if (uVar26 == 0) {
                        ppVar17 = emitter->buf;
                        uVar26 = ptls_buffer_reserve(ppVar17,2);
                        if (uVar26 == 0) {
                          puVar36 = ppVar17->base;
                          sVar50 = ppVar17->off;
                          (puVar36 + sVar50)[0] = '\0';
                          (puVar36 + sVar50)[1] = '\0';
                          ppVar17->off = ppVar17->off + 2;
                          uVar26 = 0;
                        }
                        cVar71 = '\x03';
                        if (uVar26 == 0) {
                          ppVar17 = emitter->buf;
                          local_608 = ppVar17->off;
                          uVar26 = ptls_buffer_reserve(ppVar17,2);
                          if (uVar26 == 0) {
                            puVar36 = ppVar17->base;
                            sVar50 = ppVar17->off;
                            (puVar36 + sVar50)[0] = '\0';
                            (puVar36 + sVar50)[1] = '+';
                            ppVar17->off = ppVar17->off + 2;
                            uVar26 = 0;
                          }
                          if (uVar26 == 0) {
                            ppVar17 = emitter->buf;
                            uVar26 = ptls_buffer_reserve(ppVar17,2);
                            uVar6 = local_518.selected_version;
                            if (uVar26 == 0) {
                              puVar36 = ppVar17->base;
                              sVar50 = ppVar17->off;
                              (puVar36 + sVar50)[0] = '\0';
                              (puVar36 + sVar50)[1] = '\0';
                              ppVar17->off = ppVar17->off + 2;
                              uVar26 = 0;
                            }
                            cVar71 = '\x03';
                            if (uVar26 == 0) {
                              ppVar17 = emitter->buf;
                              sVar50 = ppVar17->off;
                              uVar26 = ptls_buffer_reserve(ppVar17,2);
                              if (uVar26 == 0) {
                                *(uint16_t *)(ppVar17->base + ppVar17->off) =
                                     uVar6 << 8 | uVar6 >> 8;
                                ppVar17->off = ppVar17->off + 2;
                                uVar26 = 0;
                              }
                              if (uVar26 == 0) {
                                uVar41 = emitter->buf->off - sVar50;
                                lVar38 = 8;
                                do {
                                  emitter->buf->base[sVar50 - 2] =
                                       (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                  lVar38 = lVar38 + -8;
                                  sVar50 = sVar50 + 1;
                                } while (lVar38 != -8);
                                cVar71 = '\0';
                              }
                              else {
                                cVar71 = (uVar26 != 0) * '\x03';
                              }
                            }
                            puVar36 = local_5e8.server_name.base;
                            if (cVar71 == '\0') {
                              if ((ptls_key_exchange_algorithm_t *)local_5e8.server_name.base ==
                                  (ptls_key_exchange_algorithm_t *)0x0 ||
                                  ppVar30 != (ptls_key_exchange_algorithm_t *)0x0) {
LAB_001148f2:
                                ppVar17 = emitter->buf;
                                uVar26 = ptls_buffer_reserve(ppVar17,2);
                                if (uVar26 == 0) {
                                  puVar39 = ppVar17->base;
                                  sVar50 = ppVar17->off;
                                  (puVar39 + sVar50)[0] = '\0';
                                  (puVar39 + sVar50)[1] = ',';
                                  ppVar17->off = ppVar17->off + 2;
                                  uVar26 = 0;
                                }
                                bVar68 = uVar26 != 0;
                                if (bVar68) {
LAB_00114c0f:
                                  cVar71 = bVar68 * '\x03';
                                }
                                else {
                                  uVar26 = ptls_buffer_reserve(ppVar17,2);
                                  if (uVar26 == 0) {
                                    puVar39 = ppVar17->base;
                                    sVar50 = ppVar17->off;
                                    (puVar39 + sVar50)[0] = '\0';
                                    (puVar39 + sVar50)[1] = '\0';
                                    ppVar17->off = ppVar17->off + 2;
                                    uVar26 = 0;
                                  }
                                  cVar71 = '\x03';
                                  if (uVar26 == 0) {
                                    sVar50 = ppVar17->off;
                                    uVar26 = ptls_buffer_reserve(ppVar17,2);
                                    if (uVar26 == 0) {
                                      puVar39 = ppVar17->base;
                                      sVar61 = ppVar17->off;
                                      (puVar39 + sVar61)[0] = '\0';
                                      (puVar39 + sVar61)[1] = '\0';
                                      ppVar17->off = ppVar17->off + 2;
                                      uVar26 = 0;
                                    }
                                    cVar71 = '\x03';
                                    if (uVar26 == 0) {
                                      local_658 = ppVar17->off;
                                      uVar26 = ptls_buffer_reserve(ppVar17,2);
                                      if (uVar26 == 0) {
                                        puVar39 = ppVar17->base;
                                        sVar61 = ppVar17->off;
                                        (puVar39 + sVar61)[0] = '\0';
                                        (puVar39 + sVar61)[1] = '\0';
                                        ppVar17->off = ppVar17->off + 2;
                                        uVar26 = 0;
                                      }
                                      cVar71 = '\x03';
                                      if (uVar26 == 0) {
                                        local_618 = ppVar17->off;
                                        uVar26 = ptls_buffer_reserve(ppVar17,1);
                                        if (uVar26 == 0) {
                                          ppVar17->base[ppVar17->off] = '\0';
                                          ppVar17->off = ppVar17->off + 1;
                                          uVar26 = 0;
                                        }
                                        cVar71 = '\x03';
                                        if (uVar26 == 0) {
                                          sVar61 = ppVar17->off;
                                          sVar46 = tls->cipher_suite->hash->digest_size;
                                          uVar26 = ptls_buffer_reserve(ppVar17,sVar46);
                                          cVar71 = '\x03';
                                          if (uVar26 == 0) {
                                            psVar15 = tls->key_schedule->hashes[0].ctx;
                                            (*psVar15->final)(psVar15,ppVar17->base + ppVar17->off,
                                                              PTLS_HASH_FINAL_MODE_RESET);
                                            ppVar17->off = ppVar17->off + sVar46;
                                            ppVar17->base[sVar61 - 1] =
                                                 (char)(int)ppVar17->off - (char)sVar61;
                                            cVar71 = '\0';
                                          }
                                        }
                                        ppVar2 = local_558;
                                        if (cVar71 == '\0') {
                                          uVar26 = ptls_buffer_reserve(ppVar17,1);
                                          if (uVar26 == 0) {
                                            ppVar17->base[ppVar17->off] =
                                                 ppVar2 == (ptls_key_exchange_algorithm_t *)0x0;
                                            ppVar17->off = ppVar17->off + 1;
                                            uVar26 = 0;
                                          }
                                          cVar71 = '\x03';
                                          if (uVar26 == 0) {
                                            uVar41 = ppVar17->off - local_618;
                                            lVar38 = 8;
                                            do {
                                              ppVar17->base[local_618 - 2] =
                                                   (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                              lVar38 = lVar38 + -8;
                                              local_618 = local_618 + 1;
                                            } while (lVar38 != -8);
                                            cVar71 = '\0';
                                            uVar26 = 0;
                                          }
                                        }
                                      }
                                      if (cVar71 == '\0') {
                                        sVar61 = ppVar17->off;
                                        uVar26 = ptls_buffer_reserve(ppVar17,1);
                                        if (uVar26 == 0) {
                                          ppVar17->base[ppVar17->off] = '\0';
                                          ppVar17->off = ppVar17->off + 1;
                                          uVar26 = 0;
                                        }
                                        cVar71 = '\x03';
                                        if (uVar26 == 0) {
                                          sVar46 = ppVar17->off;
                                          sVar49 = (*tls->ctx->cipher_suites)->hash->digest_size;
                                          uVar26 = ptls_buffer_reserve(ppVar17,sVar49);
                                          cVar71 = '\x03';
                                          if (uVar26 == 0) {
                                            tbs_00.len = sVar61 - local_658;
                                            tbs_00.base = ppVar17->base + local_658;
                                            uVar29 = calc_cookie_signature
                                                               (tls,properties,
                                                                (ptls_key_exchange_algorithm_t *)
                                                                puVar36,tbs_00,
                                                                ppVar17->base + ppVar17->off);
                                            uVar26 = 0;
                                            if (uVar29 == 0) {
                                              ppVar17->off = ppVar17->off + sVar49;
                                              bVar68 = true;
                                              cVar71 = '\0';
                                            }
                                            else {
                                              bVar68 = false;
                                              uVar26 = uVar29;
                                            }
                                          }
                                          else {
                                            bVar68 = false;
                                          }
                                          if (bVar68) {
                                            ppVar17->base[sVar46 - 1] =
                                                 (char)(int)ppVar17->off - (char)sVar46;
                                            cVar71 = '\0';
                                          }
                                        }
                                      }
                                      if (cVar71 == '\0') {
                                        uVar41 = ppVar17->off - local_658;
                                        lVar38 = 8;
                                        do {
                                          ppVar17->base[local_658 - 2] =
                                               (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                          lVar38 = lVar38 + -8;
                                          local_658 = local_658 + 1;
                                        } while (lVar38 != -8);
                                        cVar71 = '\0';
                                      }
                                    }
                                    if (cVar71 == '\0') {
                                      uVar41 = ppVar17->off - sVar50;
                                      lVar38 = 8;
                                      do {
                                        ppVar17->base[sVar50 - 2] =
                                             (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                        lVar38 = lVar38 + -8;
                                        sVar50 = sVar50 + 1;
                                        cVar71 = '\0';
                                      } while (lVar38 != -8);
                                    }
                                  }
                                }
                              }
                              else {
                                ppVar17 = emitter->buf;
                                uVar26 = ptls_buffer_reserve(ppVar17,2);
                                if (uVar26 == 0) {
                                  puVar39 = ppVar17->base;
                                  sVar50 = ppVar17->off;
                                  (puVar39 + sVar50)[0] = '\0';
                                  (puVar39 + sVar50)[1] = '3';
                                  ppVar17->off = ppVar17->off + 2;
                                  uVar26 = 0;
                                }
                                bVar68 = uVar26 != 0;
                                if (bVar68) goto LAB_00114c0f;
                                ppVar17 = emitter->buf;
                                uVar26 = ptls_buffer_reserve(ppVar17,2);
                                if (uVar26 == 0) {
                                  puVar39 = ppVar17->base;
                                  sVar50 = ppVar17->off;
                                  (puVar39 + sVar50)[0] = '\0';
                                  (puVar39 + sVar50)[1] = '\0';
                                  ppVar17->off = ppVar17->off + 2;
                                  uVar26 = 0;
                                }
                                cVar71 = '\x03';
                                if (uVar26 == 0) {
                                  ppVar17 = emitter->buf;
                                  sVar50 = ppVar17->off;
                                  uVar63 = *(uint16_t *)puVar36;
                                  uVar26 = ptls_buffer_reserve(ppVar17,2);
                                  if (uVar26 == 0) {
                                    *(ushort *)(ppVar17->base + ppVar17->off) =
                                         uVar63 << 8 | uVar63 >> 8;
                                    ppVar17->off = ppVar17->off + 2;
                                    uVar26 = 0;
                                  }
                                  if (uVar26 == 0) {
                                    uVar41 = emitter->buf->off - sVar50;
                                    lVar38 = 8;
                                    do {
                                      emitter->buf->base[sVar50 - 2] =
                                           (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                      lVar38 = lVar38 + -8;
                                      sVar50 = sVar50 + 1;
                                    } while (lVar38 != -8);
                                    cVar71 = '\0';
                                  }
                                  else {
                                    cVar71 = (uVar26 != 0) * '\x03';
                                  }
                                }
                                if (cVar71 == '\0') goto LAB_001148f2;
                              }
                              if (cVar71 == '\0') {
                                uVar41 = emitter->buf->off - local_608;
                                lVar38 = 8;
                                do {
                                  emitter->buf->base[local_608 - 2] =
                                       (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                  lVar38 = lVar38 + -8;
                                  local_608 = local_608 + 1;
                                  cVar71 = '\0';
                                } while (lVar38 != -8);
                              }
                            }
                          }
                          else {
                            cVar71 = (uVar26 != 0) * '\x03';
                          }
                        }
                        if (cVar71 == '\0') {
                          uVar41 = ppVar16->off - sVar45;
                          lVar38 = 0x10;
                          do {
                            ppVar16->base[sVar45 - 3] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                            lVar38 = lVar38 + -8;
                            sVar45 = sVar45 + 1;
                            cVar71 = '\0';
                          } while (lVar38 != -8);
                        }
                      }
                    }
                  }
                }
                else {
LAB_00112d99:
                  cVar71 = bVar68 * '\x03';
                }
              }
            }
            if (cVar71 == '\0') {
              uVar26 = (*emitter->commit_message)(emitter);
              cVar71 = (uVar26 != 0) * '\x03';
            }
          }
          else {
            cVar71 = '\x03';
          }
          if (cVar71 != '\0') goto joined_r0x00112067;
          uVar29 = push_change_cipher_spec(tls,emitter->buf);
          uVar26 = 0x206;
          if (uVar29 != 0) {
            uVar26 = uVar29;
          }
        }
        cVar71 = '\x03';
        goto joined_r0x00112067;
      }
    }
    else {
      sVar50 = (*tls->ctx->cipher_suites)->hash->digest_size;
      tbs.len = local_518.cookie.tbs.len;
      tbs.base = local_518.cookie.tbs.base;
      uVar26 = calc_cookie_signature(tls,properties,local_558,tbs,(uint8_t *)&local_5e8);
      cVar71 = '\x03';
      if (((uVar26 == 0) && (uVar26 = 0x28, local_518.cookie.signature.len == sVar50)) &&
         (iVar25 = (*ptls_mem_equal)(local_518.cookie.signature.base,&local_5e8,sVar50), iVar25 != 0
         )) {
        key_schedule_update_ch1hash_prefix(tls->key_schedule);
        sVar50 = local_518.cookie.ch1_hash.len;
        puVar39 = local_518.cookie.ch1_hash.base;
        ppVar35 = tls->key_schedule;
        if (ppVar35->num_hashes != 0) {
          pppVar47 = &ppVar35->hashes[0].ctx;
          sVar61 = 0;
          do {
            (*(*pppVar47)->update)(*pppVar47,puVar39,sVar50);
            sVar61 = sVar61 + 1;
            pppVar47 = pppVar47 + 2;
          } while (sVar61 != ppVar35->num_hashes);
        }
        key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
        sVar50 = emitter->buf->off;
        uVar26 = (*emitter->begin_message)(emitter);
        if (uVar26 == 0) {
          ppVar16 = emitter->buf;
          ppVar35 = tls->key_schedule;
          sVar61 = ppVar16->off;
          uVar26 = ptls_buffer_reserve(ppVar16,1);
          if (uVar26 == 0) {
            ppVar16->base[ppVar16->off] = '\x02';
            ppVar16->off = ppVar16->off + 1;
            uVar26 = 0;
          }
          cVar71 = '\x03';
          if (uVar26 == 0) {
            uVar26 = ptls_buffer_reserve(ppVar16,3);
            if (uVar26 == 0) {
              puVar39 = ppVar16->base;
              sVar46 = ppVar16->off;
              puVar39[sVar46 + 2] = '\0';
              puVar39 = puVar39 + sVar46;
              puVar39[0] = '\0';
              puVar39[1] = '\0';
              ppVar16->off = ppVar16->off + 3;
              uVar26 = 0;
            }
            cVar71 = '\x03';
            if (uVar26 == 0) {
              local_620 = ppVar16->off;
              ppVar17 = emitter->buf;
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar39 = ppVar17->base;
                sVar46 = ppVar17->off;
                (puVar39 + sVar46)[0] = '\x03';
                (puVar39 + sVar46)[1] = '\x03';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              bVar69 = uVar26 != 0;
              if (uVar26 == 0) {
                uVar26 = ptls_buffer_reserve(emitter->buf,0x20);
                if (uVar26 == 0) {
                  puVar39 = emitter->buf->base;
                  sVar46 = emitter->buf->off;
                  puVar3 = puVar39 + sVar46 + 0x10;
                  puVar3[0] = 0xc2;
                  puVar3[1] = 0xa2;
                  puVar3[2] = '\x11';
                  puVar3[3] = '\x16';
                  puVar3[4] = 'z';
                  puVar3[5] = 0xbb;
                  puVar3[6] = 0x8c;
                  puVar3[7] = '^';
                  puVar3[8] = '\a';
                  puVar3[9] = 0x9e;
                  puVar3[10] = '\t';
                  puVar3[0xb] = 0xe2;
                  puVar3[0xc] = 200;
                  puVar3[0xd] = 0xa8;
                  puVar3[0xe] = '3';
                  puVar3[0xf] = 0x9c;
                  puVar39 = puVar39 + sVar46;
                  puVar39[0] = 0xcf;
                  puVar39[1] = '!';
                  puVar39[2] = 0xad;
                  puVar39[3] = 't';
                  puVar39[4] = 0xe5;
                  puVar39[5] = 0x9a;
                  puVar39[6] = 'a';
                  puVar39[7] = '\x11';
                  puVar39[8] = 0xbe;
                  puVar39[9] = '\x1d';
                  puVar39[10] = 0x8c;
                  puVar39[0xb] = '\x02';
                  puVar39[0xc] = '\x1e';
                  puVar39[0xd] = 'e';
                  puVar39[0xe] = 0xb8;
                  puVar39[0xf] = 0x91;
                  ppVar17 = emitter->buf;
                  ppVar17->off = ppVar17->off + 0x20;
                  uVar26 = ptls_buffer_reserve(ppVar17,1);
                  if (uVar26 == 0) {
                    ppVar17->base[ppVar17->off] = '\0';
                    ppVar17->off = ppVar17->off + 1;
                    uVar26 = 0;
                  }
                  cVar71 = '\x03';
                  if (uVar26 == 0) {
                    sVar46 = emitter->buf->off;
                    uVar26 = ptls_buffer__do_pushv
                                       (emitter->buf,local_518.legacy_session_id.base,
                                        local_518.legacy_session_id.len);
                    bVar69 = false;
                    if (uVar26 == 0) {
                      emitter->buf->base[sVar46 - 1] = (char)(int)emitter->buf->off - (char)sVar46;
                      bVar69 = true;
                      cVar71 = '\0';
                    }
                  }
                  else {
                    bVar69 = false;
                  }
                  if (bVar69) {
                    uVar63 = tls->cipher_suite->id;
                    ppVar17 = emitter->buf;
                    uVar26 = ptls_buffer_reserve(ppVar17,2);
                    if (uVar26 == 0) {
                      *(ushort *)(ppVar17->base + ppVar17->off) = uVar63 << 8 | uVar63 >> 8;
                      ppVar17->off = ppVar17->off + 2;
                      uVar26 = 0;
                    }
                    bVar69 = uVar26 != 0;
                    if (bVar69) goto LAB_00112b41;
                    ppVar17 = emitter->buf;
                    uVar26 = ptls_buffer_reserve(ppVar17,1);
                    if (uVar26 == 0) {
                      ppVar17->base[ppVar17->off] = '\0';
                      ppVar17->off = ppVar17->off + 1;
                      uVar26 = 0;
                    }
                    cVar71 = '\x03';
                    if (uVar26 == 0) {
                      ppVar17 = emitter->buf;
                      uVar26 = ptls_buffer_reserve(ppVar17,2);
                      if (uVar26 == 0) {
                        puVar39 = ppVar17->base;
                        sVar46 = ppVar17->off;
                        (puVar39 + sVar46)[0] = '\0';
                        (puVar39 + sVar46)[1] = '\0';
                        ppVar17->off = ppVar17->off + 2;
                        uVar26 = 0;
                      }
                      cVar71 = '\x03';
                      if (uVar26 == 0) {
                        ppVar17 = emitter->buf;
                        local_628 = ppVar17->off;
                        uVar26 = ptls_buffer_reserve(ppVar17,2);
                        if (uVar26 == 0) {
                          puVar39 = ppVar17->base;
                          sVar46 = ppVar17->off;
                          (puVar39 + sVar46)[0] = '\0';
                          (puVar39 + sVar46)[1] = '+';
                          ppVar17->off = ppVar17->off + 2;
                          uVar26 = 0;
                        }
                        if (uVar26 == 0) {
                          ppVar17 = emitter->buf;
                          uVar26 = ptls_buffer_reserve(ppVar17,2);
                          uVar6 = local_518.selected_version;
                          if (uVar26 == 0) {
                            puVar39 = ppVar17->base;
                            sVar46 = ppVar17->off;
                            (puVar39 + sVar46)[0] = '\0';
                            (puVar39 + sVar46)[1] = '\0';
                            ppVar17->off = ppVar17->off + 2;
                            uVar26 = 0;
                          }
                          cVar71 = '\x03';
                          if (uVar26 == 0) {
                            ppVar17 = emitter->buf;
                            sVar46 = ppVar17->off;
                            uVar26 = ptls_buffer_reserve(ppVar17,2);
                            if (uVar26 == 0) {
                              *(uint16_t *)(ppVar17->base + ppVar17->off) = uVar6 << 8 | uVar6 >> 8;
                              ppVar17->off = ppVar17->off + 2;
                              uVar26 = 0;
                            }
                            if (uVar26 == 0) {
                              uVar41 = emitter->buf->off - sVar46;
                              lVar38 = 8;
                              do {
                                emitter->buf->base[sVar46 - 2] =
                                     (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                lVar38 = lVar38 + -8;
                                sVar46 = sVar46 + 1;
                              } while (lVar38 != -8);
                              cVar71 = '\0';
                            }
                            else {
                              cVar71 = (uVar26 != 0) * '\x03';
                            }
                          }
                          if (cVar71 == '\0') {
                            if ((local_518.cookie._64_1_ & 1) == 0) {
LAB_0011431f:
                              ppVar17 = emitter->buf;
                              uVar26 = ptls_buffer_reserve(ppVar17,2);
                              if (uVar26 == 0) {
                                puVar39 = ppVar17->base;
                                sVar46 = ppVar17->off;
                                (puVar39 + sVar46)[0] = '\0';
                                (puVar39 + sVar46)[1] = ',';
                                ppVar17->off = ppVar17->off + 2;
                                uVar26 = 0;
                              }
                              bVar69 = uVar26 != 0;
                              if (bVar69) {
LAB_00114464:
                                cVar71 = bVar69 * '\x03';
                              }
                              else {
                                ppVar17 = emitter->buf;
                                uVar26 = ptls_buffer_reserve(ppVar17,2);
                                if (uVar26 == 0) {
                                  puVar39 = ppVar17->base;
                                  sVar46 = ppVar17->off;
                                  (puVar39 + sVar46)[0] = '\0';
                                  (puVar39 + sVar46)[1] = '\0';
                                  ppVar17->off = ppVar17->off + 2;
                                  uVar26 = 0;
                                }
                                cVar71 = '\x03';
                                if (uVar26 == 0) {
                                  sVar46 = emitter->buf->off;
                                  uVar26 = ptls_buffer__do_pushv
                                                     (emitter->buf,local_518.cookie.all.base,
                                                      local_518.cookie.all.len);
                                  if (uVar26 == 0) {
                                    uVar41 = emitter->buf->off - sVar46;
                                    lVar38 = 8;
                                    do {
                                      emitter->buf->base[sVar46 - 2] =
                                           (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                      lVar38 = lVar38 + -8;
                                      sVar46 = sVar46 + 1;
                                      cVar71 = '\0';
                                    } while (lVar38 != -8);
                                  }
                                }
                              }
                            }
                            else {
                              ppVar17 = emitter->buf;
                              uVar26 = ptls_buffer_reserve(ppVar17,2);
                              if (uVar26 == 0) {
                                puVar39 = ppVar17->base;
                                sVar46 = ppVar17->off;
                                (puVar39 + sVar46)[0] = '\0';
                                (puVar39 + sVar46)[1] = '3';
                                ppVar17->off = ppVar17->off + 2;
                                uVar26 = 0;
                              }
                              bVar69 = uVar26 != 0;
                              if (bVar69) goto LAB_00114464;
                              ppVar17 = emitter->buf;
                              uVar26 = ptls_buffer_reserve(ppVar17,2);
                              if (uVar26 == 0) {
                                puVar39 = ppVar17->base;
                                sVar46 = ppVar17->off;
                                (puVar39 + sVar46)[0] = '\0';
                                (puVar39 + sVar46)[1] = '\0';
                                ppVar17->off = ppVar17->off + 2;
                                uVar26 = 0;
                              }
                              cVar71 = '\x03';
                              if (uVar26 == 0) {
                                ppVar17 = emitter->buf;
                                sVar46 = ppVar17->off;
                                uVar63 = ppVar30->id;
                                uVar26 = ptls_buffer_reserve(ppVar17,2);
                                if (uVar26 == 0) {
                                  *(ushort *)(ppVar17->base + ppVar17->off) =
                                       uVar63 << 8 | uVar63 >> 8;
                                  ppVar17->off = ppVar17->off + 2;
                                  uVar26 = 0;
                                }
                                if (uVar26 == 0) {
                                  uVar41 = emitter->buf->off - sVar46;
                                  lVar38 = 8;
                                  do {
                                    emitter->buf->base[sVar46 - 2] =
                                         (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                    lVar38 = lVar38 + -8;
                                    sVar46 = sVar46 + 1;
                                  } while (lVar38 != -8);
                                  cVar71 = '\0';
                                }
                                else {
                                  cVar71 = (uVar26 != 0) * '\x03';
                                }
                              }
                              if (cVar71 == '\0') goto LAB_0011431f;
                            }
                            if (cVar71 == '\0') {
                              uVar41 = emitter->buf->off - local_628;
                              lVar38 = 8;
                              do {
                                emitter->buf->base[local_628 - 2] =
                                     (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                                lVar38 = lVar38 + -8;
                                local_628 = local_628 + 1;
                                cVar71 = '\0';
                              } while (lVar38 != -8);
                            }
                          }
                        }
                        else {
                          cVar71 = (uVar26 != 0) * '\x03';
                        }
                      }
                      if (cVar71 == '\0') {
                        uVar41 = ppVar16->off - local_620;
                        lVar38 = 0x10;
                        do {
                          ppVar16->base[local_620 - 3] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                          lVar38 = lVar38 + -8;
                          local_620 = local_620 + 1;
                          cVar71 = '\0';
                        } while (lVar38 != -8);
                      }
                    }
                  }
                }
              }
              else {
LAB_00112b41:
                cVar71 = bVar69 * '\x03';
              }
            }
            if (cVar71 == '\0') {
              cVar71 = '\0';
              if ((ppVar35 != (ptls_key_schedule_t *)0x0) &&
                 (cVar71 = '\0', ppVar35->num_hashes != 0)) {
                puVar39 = ppVar16->base;
                sVar46 = ppVar16->off;
                pppVar47 = &ppVar35->hashes[0].ctx;
                cVar71 = '\0';
                sVar49 = 0;
                do {
                  (*(*pppVar47)->update)(*pppVar47,puVar39 + sVar61,sVar46 - sVar61);
                  sVar49 = sVar49 + 1;
                  pppVar47 = pppVar47 + 2;
                } while (sVar49 != ppVar35->num_hashes);
              }
            }
          }
          if (cVar71 == '\0') {
            uVar26 = (*emitter->commit_message)(emitter);
            cVar71 = (uVar26 != 0) * '\x03';
          }
        }
        else {
          cVar71 = '\x03';
        }
        if (cVar71 == '\0') {
          emitter->buf->off = sVar50;
          bVar68 = true;
          cVar71 = '\0';
        }
      }
      if (cVar71 != '\0') goto joined_r0x00112067;
    }
  }
  uVar26 = report_unknown_extensions(tls,properties,local_518.unknown_extensions);
  if ((uVar26 != 0) ||
     (((((ptls_key_exchange_algorithm_t *)local_518.psk.hash_end !=
         (ptls_key_exchange_algorithm_t *)0x0 && !bVar68 && ((local_518.psk.ke_modes & 3) != 0)) &&
       (tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) &&
      (((tls->ctx->field_0x68 & 8) == 0 &&
       (ch_trunc.len = (long)local_518.psk.hash_end - (long)puVar36, ch_trunc.base = puVar36,
       uVar26 = try_psk_handshake(tls,&local_560,&local_56c,&local_518,ch_trunc), uVar26 != 0))))))
  goto LAB_00112324;
  puVar39 = local_518.psk.hash_end;
  sVar50 = local_560;
  if ((local_560 == 0xffffffffffffffff) || ((tls->ctx->field_0x68 & 8) != 0)) {
    ppVar35 = tls->key_schedule;
    if (ppVar35->num_hashes != 0) {
      pppVar47 = &ppVar35->hashes[0].ctx;
      sVar61 = 0;
      do {
        (*(*pppVar47)->update)(*pppVar47,puVar36,sVar45);
        sVar61 = sVar61 + 1;
        pppVar47 = pppVar47 + 2;
      } while (sVar61 != ppVar35->num_hashes);
    }
    if (!bVar68) {
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                      ,0xed9,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    }
    iVar25 = 0;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar31 = 0;
      iVar25 = 0;
      goto LAB_001125e8;
    }
  }
  else {
    ppVar35 = tls->key_schedule;
    if (ppVar35->num_hashes != 0) {
      sVar45 = (long)ppVar2 - (long)local_518.psk.hash_end;
      pppVar47 = &ppVar35->hashes[0].ctx;
      sVar61 = 0;
      do {
        (*(*pppVar47)->update)(*pppVar47,puVar39,sVar45);
        sVar61 = sVar61 + 1;
        pppVar47 = pppVar47 + 2;
      } while (sVar61 != ppVar35->num_hashes);
    }
    iVar25 = 1;
    if (((local_518.psk.ke_modes & 1) == 0) && (iVar25 = 2, (local_518.psk.ke_modes & 2) == 0)) {
      __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                    ,0xee4,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    tls->field_0x160 = tls->field_0x160 | 2;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar31 = local_518.psk.identities.list[sVar50].binder.len;
      memcpy(properties,local_518.psk.identities.list[sVar50].binder.base,sVar31);
LAB_001125e8:
      *(size_t *)((long)&properties->field_0 + 0x40) = sVar31;
    }
  }
  if (((local_56c != 0) && (sVar50 == 0)) && (tls->ctx->max_early_data_size != 0)) {
    puVar36 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar36;
    if (puVar36 == (uint8_t *)0x0) {
      uVar26 = 0x201;
      goto LAB_00112324;
    }
    uVar26 = derive_exporter_secret(tls,1);
    if ((uVar26 != 0) || (uVar26 = setup_traffic_protection(tls,0,"c e traffic",1,0), uVar26 != 0))
    goto LAB_00112324;
  }
  ppVar2 = local_558;
  if (iVar25 != 1) {
    if (local_558 == (st_ptls_key_exchange_algorithm_t *)0x0) {
      uVar26 = 0x28;
      if ((ptls_key_exchange_algorithm_t *)local_518.key_shares.base ==
          (ptls_key_exchange_algorithm_t *)0x0) {
        uVar26 = 0x6d;
      }
      goto LAB_00112324;
    }
    pVar22.len = pStack_550.len;
    pVar22.base = pStack_550.base;
    uVar26 = (*local_558->exchange)(local_558,&local_528,&local_538,pVar22);
    if (uVar26 != 0) goto LAB_00112324;
    tls->key_share = ppVar2;
  }
  uVar26 = (*emitter->begin_message)(emitter);
  if (uVar26 == 0) {
    ppVar16 = emitter->buf;
    ppVar35 = tls->key_schedule;
    sVar45 = ppVar16->off;
    uVar26 = ptls_buffer_reserve(ppVar16,1);
    if (uVar26 == 0) {
      ppVar16->base[ppVar16->off] = '\x02';
      ppVar16->off = ppVar16->off + 1;
      uVar26 = 0;
    }
    cVar71 = '\x03';
    if (uVar26 == 0) {
      uVar26 = ptls_buffer_reserve(ppVar16,3);
      if (uVar26 == 0) {
        puVar36 = ppVar16->base;
        sVar50 = ppVar16->off;
        puVar36[sVar50 + 2] = '\0';
        puVar36 = puVar36 + sVar50;
        puVar36[0] = '\0';
        puVar36[1] = '\0';
        ppVar16->off = ppVar16->off + 3;
        uVar26 = 0;
      }
      cVar71 = '\x03';
      if (uVar26 == 0) {
        sVar50 = ppVar16->off;
        ppVar17 = emitter->buf;
        uVar26 = ptls_buffer_reserve(ppVar17,2);
        if (uVar26 == 0) {
          puVar36 = ppVar17->base;
          sVar61 = ppVar17->off;
          (puVar36 + sVar61)[0] = '\x03';
          (puVar36 + sVar61)[1] = '\x03';
          ppVar17->off = ppVar17->off + 2;
          uVar26 = 0;
        }
        bVar68 = uVar26 == 0;
        if (bVar68) {
          uVar26 = ptls_buffer_reserve(emitter->buf,0x20);
          cVar71 = '\x03';
          if (uVar26 == 0) {
            (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
            ppVar17 = emitter->buf;
            ppVar17->off = ppVar17->off + 0x20;
            uVar26 = ptls_buffer_reserve(ppVar17,1);
            if (uVar26 == 0) {
              ppVar17->base[ppVar17->off] = '\0';
              ppVar17->off = ppVar17->off + 1;
              uVar26 = 0;
            }
            cVar71 = '\x03';
            if (uVar26 == 0) {
              sVar61 = emitter->buf->off;
              uVar26 = ptls_buffer__do_pushv
                                 (emitter->buf,local_518.legacy_session_id.base,
                                  local_518.legacy_session_id.len);
              bVar68 = false;
              if (uVar26 == 0) {
                emitter->buf->base[sVar61 - 1] = (char)(int)emitter->buf->off - (char)sVar61;
                bVar68 = true;
                cVar71 = '\0';
              }
            }
            else {
              bVar68 = false;
            }
            if (bVar68) {
              uVar63 = tls->cipher_suite->id;
              ppVar17 = emitter->buf;
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                *(ushort *)(ppVar17->base + ppVar17->off) = uVar63 << 8 | uVar63 >> 8;
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              bVar68 = uVar26 == 0;
              if (!bVar68) goto LAB_00112935;
              ppVar17 = emitter->buf;
              uVar26 = ptls_buffer_reserve(ppVar17,1);
              if (uVar26 == 0) {
                ppVar17->base[ppVar17->off] = '\0';
                ppVar17->off = ppVar17->off + 1;
                uVar26 = 0;
              }
              cVar71 = '\x03';
              if (uVar26 != 0) goto LAB_00113bf1;
              ppVar17 = emitter->buf;
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '\0';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              cVar71 = '\x03';
              if (uVar26 == 0) {
                ppVar17 = emitter->buf;
                local_640 = ppVar17->off;
                uVar26 = ptls_buffer_reserve(ppVar17,2);
                if (uVar26 == 0) {
                  puVar36 = ppVar17->base;
                  sVar61 = ppVar17->off;
                  (puVar36 + sVar61)[0] = '\0';
                  (puVar36 + sVar61)[1] = '+';
                  ppVar17->off = ppVar17->off + 2;
                  uVar26 = 0;
                }
                if (uVar26 == 0) {
                  ppVar17 = emitter->buf;
                  uVar26 = ptls_buffer_reserve(ppVar17,2);
                  uVar6 = local_518.selected_version;
                  if (uVar26 == 0) {
                    puVar36 = ppVar17->base;
                    sVar61 = ppVar17->off;
                    (puVar36 + sVar61)[0] = '\0';
                    (puVar36 + sVar61)[1] = '\0';
                    ppVar17->off = ppVar17->off + 2;
                    uVar26 = 0;
                  }
                  cVar71 = '\x03';
                  if (uVar26 == 0) {
                    ppVar17 = emitter->buf;
                    sVar61 = ppVar17->off;
                    uVar26 = ptls_buffer_reserve(ppVar17,2);
                    if (uVar26 == 0) {
                      *(uint16_t *)(ppVar17->base + ppVar17->off) = uVar6 << 8 | uVar6 >> 8;
                      ppVar17->off = ppVar17->off + 2;
                      uVar26 = 0;
                    }
                    if (uVar26 == 0) {
                      uVar41 = emitter->buf->off - sVar61;
                      lVar38 = 8;
                      do {
                        emitter->buf->base[sVar61 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                        lVar38 = lVar38 + -8;
                        sVar61 = sVar61 + 1;
                      } while (lVar38 != -8);
                      cVar71 = '\0';
                    }
                    else {
                      cVar71 = (uVar26 != 0) * '\x03';
                    }
                  }
                  if (cVar71 == '\0') {
                    ppVar17 = emitter->buf;
                    if (iVar25 == 1) {
LAB_00113a26:
                      if (iVar25 == 0) {
LAB_00113b27:
                        cVar71 = '\0';
                      }
                      else {
                        uVar26 = ptls_buffer_reserve(ppVar17,2);
                        if (uVar26 == 0) {
                          puVar36 = ppVar17->base;
                          sVar61 = ppVar17->off;
                          (puVar36 + sVar61)[0] = '\0';
                          (puVar36 + sVar61)[1] = ')';
                          ppVar17->off = ppVar17->off + 2;
                          uVar26 = 0;
                        }
                        bVar68 = uVar26 != 0;
                        if (!bVar68) {
                          uVar26 = ptls_buffer_reserve(ppVar17,2);
                          sVar61 = local_560;
                          if (uVar26 == 0) {
                            puVar36 = ppVar17->base;
                            sVar46 = ppVar17->off;
                            (puVar36 + sVar46)[0] = '\0';
                            (puVar36 + sVar46)[1] = '\0';
                            ppVar17->off = ppVar17->off + 2;
                            uVar26 = 0;
                          }
                          cVar71 = '\x03';
                          if (uVar26 != 0) goto LAB_00113b6e;
                          sVar46 = ppVar17->off;
                          uVar26 = ptls_buffer_reserve(ppVar17,2);
                          if (uVar26 == 0) {
                            *(ushort *)(ppVar17->base + ppVar17->off) =
                                 (ushort)sVar61 << 8 | (ushort)sVar61 >> 8;
                            ppVar17->off = ppVar17->off + 2;
                            uVar26 = 0;
                          }
                          bVar68 = uVar26 != 0;
                          if (!bVar68) {
                            uVar41 = ppVar17->off - sVar46;
                            lVar38 = 8;
                            do {
                              ppVar17->base[sVar46 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f))
                              ;
                              lVar38 = lVar38 + -8;
                              sVar46 = sVar46 + 1;
                            } while (lVar38 != -8);
                            goto LAB_00113b27;
                          }
                        }
LAB_00113b69:
                        cVar71 = bVar68 * '\x03';
                      }
                    }
                    else {
                      uVar26 = ptls_buffer_reserve(ppVar17,2);
                      if (uVar26 == 0) {
                        puVar36 = ppVar17->base;
                        sVar61 = ppVar17->off;
                        (puVar36 + sVar61)[0] = '\0';
                        (puVar36 + sVar61)[1] = '3';
                        ppVar17->off = ppVar17->off + 2;
                        uVar26 = 0;
                      }
                      bVar68 = uVar26 != 0;
                      if (bVar68) goto LAB_00113b69;
                      uVar26 = ptls_buffer_reserve(ppVar17,2);
                      if (uVar26 == 0) {
                        puVar36 = ppVar17->base;
                        sVar61 = ppVar17->off;
                        (puVar36 + sVar61)[0] = '\0';
                        (puVar36 + sVar61)[1] = '\0';
                        ppVar17->off = ppVar17->off + 2;
                        uVar26 = 0;
                      }
                      cVar71 = '\x03';
                      if (uVar26 == 0) {
                        sVar61 = ppVar17->off;
                        uVar63 = local_558->id;
                        uVar26 = ptls_buffer_reserve(ppVar17,2);
                        if (uVar26 == 0) {
                          *(ushort *)(ppVar17->base + ppVar17->off) = uVar63 << 8 | uVar63 >> 8;
                          ppVar17->off = ppVar17->off + 2;
                          uVar26 = 0;
                        }
                        if (uVar26 == 0) {
                          uVar26 = ptls_buffer_reserve(ppVar17,2);
                          if (uVar26 == 0) {
                            puVar36 = ppVar17->base;
                            sVar46 = ppVar17->off;
                            (puVar36 + sVar46)[0] = '\0';
                            (puVar36 + sVar46)[1] = '\0';
                            ppVar17->off = ppVar17->off + 2;
                            uVar26 = 0;
                          }
                          cVar71 = '\x03';
                          if (uVar26 == 0) {
                            local_618 = ppVar17->off;
                            uVar26 = ptls_buffer__do_pushv(ppVar17,local_528.base,local_528.len);
                            if (uVar26 != 0) goto LAB_001152d8;
                            uVar41 = ppVar17->off - local_618;
                            lVar38 = 8;
                            do {
                              ppVar17->base[local_618 - 2] =
                                   (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                              lVar38 = lVar38 + -8;
                              local_618 = local_618 + 1;
                            } while (lVar38 != -8);
                            cVar71 = '\0';
                            bVar68 = true;
                          }
                          else {
LAB_001152d8:
                            bVar68 = false;
                          }
                          if (bVar68) {
                            uVar41 = ppVar17->off - sVar61;
                            lVar38 = 8;
                            do {
                              ppVar17->base[sVar61 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f))
                              ;
                              lVar38 = lVar38 + -8;
                              sVar61 = sVar61 + 1;
                            } while (lVar38 != -8);
                            cVar71 = '\0';
                          }
                        }
                        else {
                          cVar71 = (uVar26 != 0) * '\x03';
                        }
                      }
                      if (cVar71 == '\0') goto LAB_00113a26;
                    }
LAB_00113b6e:
                    if (cVar71 == '\0') {
                      uVar41 = emitter->buf->off - local_640;
                      lVar38 = 8;
                      do {
                        emitter->buf->base[local_640 - 2] =
                             (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                        lVar38 = lVar38 + -8;
                        local_640 = local_640 + 1;
                        cVar71 = '\0';
                      } while (lVar38 != -8);
                    }
                  }
                }
                else {
                  cVar71 = (uVar26 != 0) * '\x03';
                }
              }
              if (cVar71 == '\0') {
                uVar41 = ppVar16->off - sVar50;
                lVar38 = 0x10;
                do {
                  ppVar16->base[sVar50 - 3] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                  lVar38 = lVar38 + -8;
                  sVar50 = sVar50 + 1;
                } while (lVar38 != -8);
                cVar71 = '\0';
              }
            }
          }
        }
        else {
LAB_00112935:
          cVar71 = !bVar68 * '\x03';
        }
      }
LAB_00113bf1:
      if (cVar71 == '\0') {
        if ((ppVar35 != (ptls_key_schedule_t *)0x0) && (ppVar35->num_hashes != 0)) {
          puVar36 = ppVar16->base;
          sVar50 = ppVar16->off;
          pppVar47 = &ppVar35->hashes[0].ctx;
          sVar61 = 0;
          do {
            (*(*pppVar47)->update)(*pppVar47,puVar36 + sVar45,sVar50 - sVar45);
            sVar61 = sVar61 + 1;
            pppVar47 = pppVar47 + 2;
          } while (sVar61 != ppVar35->num_hashes);
        }
        cVar71 = '\0';
      }
    }
    if (cVar71 == '\0') {
      uVar26 = (*emitter->commit_message)(emitter);
      cVar71 = (uVar26 != 0) * '\x03';
    }
  }
  else {
    cVar71 = '\x03';
  }
  if (cVar71 == '\x03') goto LAB_00112324;
  if (cVar71 != '\0') {
    return uVar26;
  }
  uVar26 = push_change_cipher_spec(tls,emitter->buf);
  if (uVar26 != 0) goto LAB_00112324;
  if (tls->key_schedule->generation != 1) {
    __assert_fail("tls->key_schedule->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0xf19,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  ikm.len = local_538.len;
  ikm.base = local_538.base;
  key_schedule_extract(tls->key_schedule,ikm);
  uVar26 = setup_traffic_protection(tls,1,"s hs traffic",2,0);
  if (uVar26 != 0) goto LAB_00112324;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    uVar26 = setup_traffic_protection(tls,0,"c hs traffic",2,0);
    if (uVar26 != 0) goto LAB_00112324;
    if (local_518.psk.early_data_indication != 0) {
      (tls->field_20).server.early_data_skipped_bytes = 0;
    }
  }
  else {
    uVar26 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
    if ((uVar26 != 0) ||
       ((psVar14 = tls->ctx->update_traffic_key, psVar14 != (st_ptls_update_traffic_key_t *)0x0 &&
        (uVar26 = (*psVar14->cb)(psVar14,tls,0,2,tls->pending_handshake_secret), uVar26 != 0))))
    goto LAB_00112324;
  }
  uVar26 = (*emitter->begin_message)(emitter);
  if (uVar26 == 0) {
    ppVar16 = emitter->buf;
    ppVar35 = tls->key_schedule;
    sVar45 = ppVar16->off;
    uVar26 = ptls_buffer_reserve(ppVar16,1);
    if (uVar26 == 0) {
      ppVar16->base[ppVar16->off] = '\b';
      ppVar16->off = ppVar16->off + 1;
      uVar26 = 0;
    }
    cVar71 = '\x03';
    if (uVar26 == 0) {
      uVar26 = ptls_buffer_reserve(ppVar16,3);
      if (uVar26 == 0) {
        puVar36 = ppVar16->base;
        sVar50 = ppVar16->off;
        puVar36[sVar50 + 2] = '\0';
        puVar36 = puVar36 + sVar50;
        puVar36[0] = '\0';
        puVar36[1] = '\0';
        ppVar16->off = ppVar16->off + 3;
        uVar26 = 0;
      }
      cVar71 = '\x03';
      if (uVar26 == 0) {
        sVar50 = ppVar16->off;
        ppVar17 = emitter->buf;
        uVar26 = ptls_buffer_reserve(ppVar17,2);
        if (uVar26 == 0) {
          puVar36 = ppVar17->base;
          sVar61 = ppVar17->off;
          (puVar36 + sVar61)[0] = '\0';
          (puVar36 + sVar61)[1] = '\0';
          ppVar17->off = ppVar17->off + 2;
          uVar26 = 0;
        }
        cVar71 = '\x03';
        if (uVar26 == 0) {
          local_658 = ppVar17->off;
          if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
            if (tls->server_name != (char *)0x0) {
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '\0';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              bVar68 = uVar26 != 0;
              if (bVar68) goto LAB_00114df1;
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '\0';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              cVar71 = '\x03';
              if (uVar26 == 0) {
                sVar61 = ppVar17->off;
                lVar38 = -2;
                do {
                  ppVar17->base[lVar38 + sVar61] = '\0';
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 0);
                cVar71 = '\0';
              }
              if (uVar26 != 0) goto LAB_00114df7;
            }
LAB_0011403d:
            if (tls->negotiated_protocol != (char *)0x0) {
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '\x10';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              bVar68 = uVar26 != 0;
              if (bVar68) goto LAB_00114df1;
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '\0';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              cVar71 = '\x03';
              if (uVar26 == 0) {
                sVar61 = ppVar17->off;
                uVar26 = ptls_buffer_reserve(ppVar17,2);
                if (uVar26 == 0) {
                  puVar36 = ppVar17->base;
                  sVar46 = ppVar17->off;
                  (puVar36 + sVar46)[0] = '\0';
                  (puVar36 + sVar46)[1] = '\0';
                  ppVar17->off = ppVar17->off + 2;
                  uVar26 = 0;
                }
                cVar71 = '\x03';
                if (uVar26 == 0) {
                  local_618 = ppVar17->off;
                  uVar26 = ptls_buffer_reserve(ppVar17,1);
                  if (uVar26 == 0) {
                    ppVar17->base[ppVar17->off] = '\0';
                    ppVar17->off = ppVar17->off + 1;
                    uVar26 = 0;
                  }
                  cVar71 = '\x03';
                  if (uVar26 == 0) {
                    sVar46 = ppVar17->off;
                    pcVar8 = tls->negotiated_protocol;
                    sVar31 = strlen(pcVar8);
                    uVar26 = ptls_buffer__do_pushv(ppVar17,pcVar8,sVar31);
                    bVar68 = false;
                    if (uVar26 == 0) {
                      ppVar17->base[sVar46 - 1] = (char)(int)ppVar17->off - (char)sVar46;
                      bVar68 = true;
                      cVar71 = '\0';
                    }
                  }
                  else {
                    bVar68 = false;
                  }
                  if (bVar68) {
                    uVar41 = ppVar17->off - local_618;
                    lVar38 = 8;
                    do {
                      ppVar17->base[local_618 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                      lVar38 = lVar38 + -8;
                      local_618 = local_618 + 1;
                    } while (lVar38 != -8);
                    cVar71 = '\0';
                  }
                }
                if (cVar71 == '\0') {
                  uVar41 = ppVar17->off - sVar61;
                  lVar38 = 8;
                  do {
                    ppVar17->base[sVar61 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                    lVar38 = lVar38 + -8;
                    sVar61 = sVar61 + 1;
                  } while (lVar38 != -8);
                  cVar71 = '\0';
                }
              }
              if (cVar71 != '\0') goto LAB_00114df7;
            }
            if (tls->pending_handshake_secret != (uint8_t *)0x0) {
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '*';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              bVar68 = uVar26 != 0;
              if (bVar68) goto LAB_00114df1;
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '\0';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              cVar71 = '\x03';
              if (uVar26 == 0) {
                sVar61 = ppVar17->off;
                lVar38 = -2;
                do {
                  ppVar17->base[lVar38 + sVar61] = '\0';
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 0);
                cVar71 = '\0';
              }
              if (uVar26 != 0) goto LAB_00114df7;
            }
            uVar26 = push_additional_extensions(properties,ppVar17);
            cVar71 = '\x03';
            if (uVar26 == 0) {
              uVar41 = ppVar17->off - local_658;
              lVar38 = 8;
              do {
                ppVar17->base[local_658 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                lVar38 = lVar38 + -8;
                local_658 = local_658 + 1;
                cVar71 = '\0';
                uVar26 = 0;
              } while (lVar38 != -8);
            }
          }
          else {
            uVar26 = ptls_buffer_reserve(ppVar17,2);
            if (uVar26 == 0) {
              puVar36 = ppVar17->base;
              sVar61 = ppVar17->off;
              (puVar36 + sVar61)[0] = 0xff;
              (puVar36 + sVar61)[1] = 0xce;
              ppVar17->off = ppVar17->off + 2;
              uVar26 = 0;
            }
            bVar68 = uVar26 != 0;
            if (!bVar68) {
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar61 = ppVar17->off;
                (puVar36 + sVar61)[0] = '\0';
                (puVar36 + sVar61)[1] = '\0';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              cVar71 = '\x03';
              if (uVar26 == 0) {
                sVar61 = ppVar17->off;
                psVar32 = tls->esni;
                uVar26 = ptls_buffer_reserve(ppVar17,0x10);
                if (uVar26 == 0) {
                  puVar36 = ppVar17->base;
                  sVar46 = ppVar17->off;
                  uVar18 = *(undefined8 *)(psVar32->nonce + 8);
                  *(undefined8 *)(puVar36 + sVar46) = *(undefined8 *)psVar32->nonce;
                  *(undefined8 *)(puVar36 + sVar46 + 8) = uVar18;
                  ppVar17->off = ppVar17->off + 0x10;
                  uVar26 = 0;
                }
                if (uVar26 != 0) goto LAB_00113f63;
                uVar41 = ppVar17->off - sVar61;
                lVar38 = 8;
                do {
                  ppVar17->base[sVar61 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                  lVar38 = lVar38 + -8;
                  sVar61 = sVar61 + 1;
                } while (lVar38 != -8);
                cVar71 = '\0';
                bVar68 = true;
              }
              else {
LAB_00113f63:
                bVar68 = false;
              }
              if (!bVar68) goto LAB_00114df7;
              free_esni_secret(&tls->esni,1);
              goto LAB_0011403d;
            }
LAB_00114df1:
            cVar71 = bVar68 * '\x03';
          }
        }
LAB_00114df7:
        if (cVar71 == '\0') {
          uVar41 = ppVar16->off - sVar50;
          lVar38 = 0x10;
          do {
            ppVar16->base[sVar50 - 3] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
            lVar38 = lVar38 + -8;
            sVar50 = sVar50 + 1;
          } while (lVar38 != -8);
          cVar71 = '\0';
        }
      }
      if (((cVar71 == '\0') && (cVar71 = '\0', ppVar35 != (ptls_key_schedule_t *)0x0)) &&
         (ppVar35->num_hashes != 0)) {
        puVar36 = ppVar16->base;
        sVar50 = ppVar16->off;
        pppVar47 = &ppVar35->hashes[0].ctx;
        cVar71 = '\0';
        sVar61 = 0;
        do {
          (*(*pppVar47)->update)(*pppVar47,puVar36 + sVar45,sVar50 - sVar45);
          sVar61 = sVar61 + 1;
          pppVar47 = pppVar47 + 2;
        } while (sVar61 != ppVar35->num_hashes);
      }
    }
    if (cVar71 == '\0') {
      uVar26 = (*emitter->commit_message)(emitter);
      cVar71 = (uVar26 != 0) * '\x03';
    }
  }
  else {
    cVar71 = '\x03';
  }
  if (cVar71 == '\x03') goto LAB_00112324;
  if (cVar71 != '\0') {
    return uVar26;
  }
  if (iVar25 == 0) {
    if ((tls->ctx->field_0x68 & 8) == 0) goto LAB_00110615;
    uVar26 = (*emitter->begin_message)(emitter);
    if (uVar26 == 0) {
      ppVar16 = emitter->buf;
      ppVar35 = tls->key_schedule;
      sVar45 = ppVar16->off;
      uVar26 = ptls_buffer_reserve(ppVar16,1);
      if (uVar26 == 0) {
        ppVar16->base[ppVar16->off] = '\r';
        ppVar16->off = ppVar16->off + 1;
        uVar26 = 0;
      }
      cVar71 = '\x03';
      if (uVar26 == 0) {
        uVar26 = ptls_buffer_reserve(ppVar16,3);
        if (uVar26 == 0) {
          puVar36 = ppVar16->base;
          sVar50 = ppVar16->off;
          puVar36[sVar50 + 2] = '\0';
          puVar36 = puVar36 + sVar50;
          puVar36[0] = '\0';
          puVar36[1] = '\0';
          ppVar16->off = ppVar16->off + 3;
          uVar26 = 0;
        }
        cVar71 = '\x03';
        if (uVar26 == 0) {
          sVar50 = ppVar16->off;
          ppVar17 = emitter->buf;
          uVar26 = ptls_buffer_reserve(ppVar17,1);
          if (uVar26 == 0) {
            ppVar17->base[ppVar17->off] = '\0';
            ppVar17->off = ppVar17->off + 1;
            uVar26 = 0;
          }
          cVar71 = '\x03';
          if (uVar26 == 0) {
            uVar26 = ptls_buffer_reserve(ppVar17,2);
            if (uVar26 == 0) {
              puVar36 = ppVar17->base;
              sVar61 = ppVar17->off;
              (puVar36 + sVar61)[0] = '\0';
              (puVar36 + sVar61)[1] = '\0';
              ppVar17->off = ppVar17->off + 2;
              uVar26 = 0;
            }
            if (uVar26 == 0) {
              sVar61 = ppVar17->off;
              uVar26 = ptls_buffer_reserve(ppVar17,2);
              if (uVar26 == 0) {
                puVar36 = ppVar17->base;
                sVar46 = ppVar17->off;
                (puVar36 + sVar46)[0] = '\0';
                (puVar36 + sVar46)[1] = '\r';
                ppVar17->off = ppVar17->off + 2;
                uVar26 = 0;
              }
              if (uVar26 == 0) {
                uVar26 = ptls_buffer_reserve(ppVar17,2);
                if (uVar26 == 0) {
                  puVar36 = ppVar17->base;
                  sVar46 = ppVar17->off;
                  (puVar36 + sVar46)[0] = '\0';
                  (puVar36 + sVar46)[1] = '\0';
                  ppVar17->off = ppVar17->off + 2;
                  uVar26 = 0;
                }
                cVar71 = '\x03';
                if (uVar26 == 0) {
                  local_648 = ppVar17->off;
                  uVar26 = push_signature_algorithms(ppVar17);
                  if (uVar26 != 0) goto LAB_00115171;
                  uVar41 = ppVar17->off - local_648;
                  lVar38 = 8;
                  do {
                    ppVar17->base[local_648 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                    lVar38 = lVar38 + -8;
                    local_648 = local_648 + 1;
                  } while (lVar38 != -8);
                  cVar71 = '\0';
                  bVar68 = true;
                }
                else {
LAB_00115171:
                  bVar68 = false;
                }
                if (bVar68) {
                  uVar41 = ppVar17->off - sVar61;
                  lVar38 = 8;
                  do {
                    ppVar17->base[sVar61 - 2] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
                    lVar38 = lVar38 + -8;
                    sVar61 = sVar61 + 1;
                    cVar71 = '\0';
                  } while (lVar38 != -8);
                }
              }
              else {
                cVar71 = (uVar26 != 0) * '\x03';
              }
            }
          }
          if (cVar71 == '\0') {
            uVar41 = ppVar16->off - sVar50;
            lVar38 = 0x10;
            do {
              ppVar16->base[sVar50 - 3] = (uint8_t)(uVar41 >> ((byte)lVar38 & 0x3f));
              lVar38 = lVar38 + -8;
              sVar50 = sVar50 + 1;
            } while (lVar38 != -8);
            cVar71 = '\0';
          }
        }
        if (((cVar71 == '\0') && (cVar71 = '\0', ppVar35 != (ptls_key_schedule_t *)0x0)) &&
           (ppVar35->num_hashes != 0)) {
          puVar36 = ppVar16->base;
          sVar50 = ppVar16->off;
          pppVar47 = &ppVar35->hashes[0].ctx;
          cVar71 = '\0';
          sVar61 = 0;
          do {
            (*(*pppVar47)->update)(*pppVar47,puVar36 + sVar45,sVar50 - sVar45);
            sVar61 = sVar61 + 1;
            pppVar47 = pppVar47 + 2;
          } while (sVar61 != ppVar35->num_hashes);
        }
      }
      if (cVar71 == '\0') {
        uVar26 = (*emitter->commit_message)(emitter);
        cVar71 = (uVar26 != 0) * '\x03';
      }
    }
    else {
      cVar71 = '\x03';
    }
    if (cVar71 == '\x03') goto LAB_00112324;
    if (cVar71 != '\0') {
      return uVar26;
    }
    if (uVar26 != 0) goto LAB_00112324;
    goto LAB_00110615;
  }
LAB_00110659:
  send_finished(tls,emitter);
  if (tls->key_schedule->generation != 2) {
    __assert_fail("tls->key_schedule->generation == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0xf6f,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  uVar26 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
  if (((uVar26 == 0) && (uVar26 = setup_traffic_protection(tls,1,"s ap traffic",3,0), uVar26 == 0))
     && ((uVar26 = derive_secret(tls->key_schedule,&tls->field_20,"c ap traffic"), uVar26 == 0 &&
         (uVar26 = derive_exporter_secret(tls,0), uVar26 == 0)))) {
    bVar62 = tls->ctx->field_0x68;
    if (tls->pending_handshake_secret == (uint8_t *)0x0) {
      eVar28 = (uint)((bVar62 & 8) == 0) * 3 + PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
    }
    else {
      eVar28 = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
      if ((bVar62 & 0x10) != 0) {
        uVar26 = commission_handshake_secret(tls);
        if (uVar26 != 0) goto LAB_00112324;
        eVar28 = PTLS_STATE_SERVER_EXPECT_FINISHED;
      }
    }
    tls->state = eVar28;
    if ((((local_518.psk.ke_modes == 0) || (tls->ctx->ticket_lifetime == 0)) ||
        (uVar26 = send_session_ticket(tls,emitter), uVar26 == 0)) &&
       (uVar26 = 0x202, (tls->ctx->field_0x68 & 8) == 0)) {
      uVar26 = 0;
    }
  }
LAB_00112324:
  free(local_528.base);
  free(local_538.base);
  (*ptls_clear_memory)(&local_5e8,0x40);
  return uVar26;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch.legacy_session_id.base, ch.legacy_session_id.len); });         \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch.selected_version); });                                     \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }